

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersectorK<4,8>::
     intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined8 uVar1;
  Primitive PVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  RTCRayQueryContext *pRVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int iVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  uint uVar85;
  int iVar86;
  undefined1 (*pauVar87) [32];
  uint uVar88;
  uint uVar89;
  long lVar90;
  ulong uVar91;
  ulong uVar92;
  ulong uVar93;
  float fVar94;
  float fVar130;
  float fVar132;
  vint4 bi_2;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar109 [16];
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined4 uVar95;
  float fVar96;
  undefined1 auVar112 [32];
  float fVar131;
  float fVar133;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar108 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  float fVar155;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  vint4 ai_2;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar201;
  float fVar216;
  float fVar219;
  vint4 ai;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar222;
  undefined1 auVar212 [32];
  float fVar217;
  float fVar220;
  float fVar223;
  undefined1 auVar213 [32];
  float fVar218;
  float fVar221;
  float fVar224;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  vint4 bi;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar242 [32];
  undefined1 auVar240 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar243 [32];
  undefined1 auVar241 [16];
  undefined1 auVar244 [64];
  vint4 ai_1;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar256;
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  float fVar257;
  float fVar261;
  float fVar262;
  undefined1 auVar258 [16];
  float fVar263;
  undefined1 auVar259 [16];
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar260 [64];
  undefined1 auVar267 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar272;
  undefined1 auVar271 [64];
  float fVar273;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [32];
  undefined1 auVar278 [16];
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_ca4;
  float local_c20;
  float fStack_c1c;
  float fStack_c18;
  float fStack_c14;
  float fStack_bec;
  float fStack_be8;
  float fStack_be4;
  RTCFilterFunctionNArguments local_bb0;
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 (*local_b28) [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  ulong local_9e0;
  undefined1 auStack_9d8 [24];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [16];
  Primitive *local_948;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined4 local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 uStack_8e8;
  undefined4 uStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  uint local_7e0;
  uint uStack_7dc;
  uint uStack_7d8;
  uint uStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  uint uStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 local_680 [32];
  uint local_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  uint uStack_650;
  uint uStack_64c;
  uint uStack_648;
  uint uStack_644;
  uint local_640;
  uint uStack_63c;
  uint uStack_638;
  uint uStack_634;
  uint uStack_630;
  uint uStack_62c;
  uint uStack_628;
  uint uStack_624;
  undefined1 local_620 [32];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined4 local_5e0;
  undefined4 uStack_5dc;
  undefined4 uStack_5d8;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined4 uStack_5c8;
  undefined4 uStack_5c4;
  undefined4 local_5c0;
  undefined4 uStack_5bc;
  undefined4 uStack_5b8;
  undefined4 uStack_5b4;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  undefined4 uStack_5a8;
  undefined4 uStack_5a4;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_400 [32];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar268 [16];
  undefined1 auVar277 [64];
  undefined1 auVar282 [64];
  
  PVar2 = prim[1];
  uVar92 = (ulong)(byte)PVar2;
  fVar94 = *(float *)(prim + uVar92 * 0x19 + 0x12);
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar7 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar7 = vsubps_avx(auVar7,*(undefined1 (*) [16])(prim + uVar92 * 0x19 + 6));
  auVar97._0_4_ = fVar94 * auVar7._0_4_;
  auVar97._4_4_ = fVar94 * auVar7._4_4_;
  auVar97._8_4_ = fVar94 * auVar7._8_4_;
  auVar97._12_4_ = fVar94 * auVar7._12_4_;
  auVar225._0_4_ = fVar94 * auVar8._0_4_;
  auVar225._4_4_ = fVar94 * auVar8._4_4_;
  auVar225._8_4_ = fVar94 * auVar8._8_4_;
  auVar225._12_4_ = fVar94 * auVar8._12_4_;
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 4 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 5 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 6 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar92 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  uVar93 = (ulong)(uint)((int)(uVar92 * 9) * 2);
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + uVar92 + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  uVar93 = (ulong)(uint)((int)(uVar92 * 5) << 2);
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar292._4_4_ = auVar225._0_4_;
  auVar292._0_4_ = auVar225._0_4_;
  auVar292._8_4_ = auVar225._0_4_;
  auVar292._12_4_ = auVar225._0_4_;
  auVar138 = vshufps_avx(auVar225,auVar225,0x55);
  auVar98 = vshufps_avx(auVar225,auVar225,0xaa);
  fVar94 = auVar98._0_4_;
  auVar274._0_4_ = fVar94 * auVar9._0_4_;
  fVar130 = auVar98._4_4_;
  auVar274._4_4_ = fVar130 * auVar9._4_4_;
  fVar201 = auVar98._8_4_;
  auVar274._8_4_ = fVar201 * auVar9._8_4_;
  fVar216 = auVar98._12_4_;
  auVar274._12_4_ = fVar216 * auVar9._12_4_;
  auVar267._0_4_ = auVar12._0_4_ * fVar94;
  auVar267._4_4_ = auVar12._4_4_ * fVar130;
  auVar267._8_4_ = auVar12._8_4_ * fVar201;
  auVar267._12_4_ = auVar12._12_4_ * fVar216;
  auVar245._0_4_ = auVar105._0_4_ * fVar94;
  auVar245._4_4_ = auVar105._4_4_ * fVar130;
  auVar245._8_4_ = auVar105._8_4_ * fVar201;
  auVar245._12_4_ = auVar105._12_4_ * fVar216;
  auVar98 = vfmadd231ps_fma(auVar274,auVar138,auVar8);
  auVar139 = vfmadd231ps_fma(auVar267,auVar138,auVar11);
  auVar138 = vfmadd231ps_fma(auVar245,auVar99,auVar138);
  auVar179 = vfmadd231ps_fma(auVar98,auVar292,auVar7);
  auVar139 = vfmadd231ps_fma(auVar139,auVar292,auVar10);
  auVar203 = vfmadd231ps_fma(auVar138,auVar100,auVar292);
  auVar293._4_4_ = auVar97._0_4_;
  auVar293._0_4_ = auVar97._0_4_;
  auVar293._8_4_ = auVar97._0_4_;
  auVar293._12_4_ = auVar97._0_4_;
  auVar138 = vshufps_avx(auVar97,auVar97,0x55);
  auVar98 = vshufps_avx(auVar97,auVar97,0xaa);
  fVar94 = auVar98._0_4_;
  auVar226._0_4_ = fVar94 * auVar9._0_4_;
  fVar130 = auVar98._4_4_;
  auVar226._4_4_ = fVar130 * auVar9._4_4_;
  fVar201 = auVar98._8_4_;
  auVar226._8_4_ = fVar201 * auVar9._8_4_;
  fVar216 = auVar98._12_4_;
  auVar226._12_4_ = fVar216 * auVar9._12_4_;
  auVar137._0_4_ = auVar12._0_4_ * fVar94;
  auVar137._4_4_ = auVar12._4_4_ * fVar130;
  auVar137._8_4_ = auVar12._8_4_ * fVar201;
  auVar137._12_4_ = auVar12._12_4_ * fVar216;
  auVar98._0_4_ = auVar105._0_4_ * fVar94;
  auVar98._4_4_ = auVar105._4_4_ * fVar130;
  auVar98._8_4_ = auVar105._8_4_ * fVar201;
  auVar98._12_4_ = auVar105._12_4_ * fVar216;
  auVar8 = vfmadd231ps_fma(auVar226,auVar138,auVar8);
  auVar9 = vfmadd231ps_fma(auVar137,auVar138,auVar11);
  auVar11 = vfmadd231ps_fma(auVar98,auVar138,auVar99);
  auVar12 = vfmadd231ps_fma(auVar8,auVar293,auVar7);
  auVar99 = vfmadd231ps_fma(auVar9,auVar293,auVar10);
  auVar105 = vfmadd231ps_fma(auVar11,auVar293,auVar100);
  auVar238._8_4_ = 0x7fffffff;
  auVar238._0_8_ = 0x7fffffff7fffffff;
  auVar238._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx(auVar179,auVar238);
  auVar202._8_4_ = 0x219392ef;
  auVar202._0_8_ = 0x219392ef219392ef;
  auVar202._12_4_ = 0x219392ef;
  auVar7 = vcmpps_avx(auVar7,auVar202,1);
  auVar8 = vblendvps_avx(auVar179,auVar202,auVar7);
  auVar7 = vandps_avx(auVar139,auVar238);
  auVar7 = vcmpps_avx(auVar7,auVar202,1);
  auVar9 = vblendvps_avx(auVar139,auVar202,auVar7);
  auVar7 = vandps_avx(auVar203,auVar238);
  auVar7 = vcmpps_avx(auVar7,auVar202,1);
  auVar7 = vblendvps_avx(auVar203,auVar202,auVar7);
  auVar10 = vrcpps_avx(auVar8);
  auVar239._8_4_ = 0x3f800000;
  auVar239._0_8_ = 0x3f8000003f800000;
  auVar239._12_4_ = 0x3f800000;
  auVar8 = vfnmadd213ps_fma(auVar8,auVar10,auVar239);
  auVar10 = vfmadd132ps_fma(auVar8,auVar10,auVar10);
  auVar8 = vrcpps_avx(auVar9);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar8,auVar239);
  auVar11 = vfmadd132ps_fma(auVar9,auVar8,auVar8);
  auVar8 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar8,auVar239);
  auVar100 = vfmadd132ps_fma(auVar7,auVar8,auVar8);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar92 * 7 + 6);
  auVar7 = vpmovsxwd_avx(auVar7);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar12);
  auVar203._0_4_ = auVar10._0_4_ * auVar7._0_4_;
  auVar203._4_4_ = auVar10._4_4_ * auVar7._4_4_;
  auVar203._8_4_ = auVar10._8_4_ * auVar7._8_4_;
  auVar203._12_4_ = auVar10._12_4_ * auVar7._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar92 * 9 + 6);
  auVar7 = vpmovsxwd_avx(auVar8);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar12);
  auVar227._0_4_ = auVar10._0_4_ * auVar7._0_4_;
  auVar227._4_4_ = auVar10._4_4_ * auVar7._4_4_;
  auVar227._8_4_ = auVar10._8_4_ * auVar7._8_4_;
  auVar227._12_4_ = auVar10._12_4_ * auVar7._12_4_;
  auVar139._1_3_ = 0;
  auVar139[0] = PVar2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar8 = vpmovsxwd_avx(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar92 * -2 + 6);
  auVar7 = vpmovsxwd_avx(auVar10);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar99);
  auVar246._0_4_ = auVar7._0_4_ * auVar11._0_4_;
  auVar246._4_4_ = auVar7._4_4_ * auVar11._4_4_;
  auVar246._8_4_ = auVar7._8_4_ * auVar11._8_4_;
  auVar246._12_4_ = auVar7._12_4_ * auVar11._12_4_;
  auVar7 = vcvtdq2ps_avx(auVar8);
  auVar7 = vsubps_avx(auVar7,auVar99);
  auVar138._0_4_ = auVar11._0_4_ * auVar7._0_4_;
  auVar138._4_4_ = auVar11._4_4_ * auVar7._4_4_;
  auVar138._8_4_ = auVar11._8_4_ * auVar7._8_4_;
  auVar138._12_4_ = auVar11._12_4_ * auVar7._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar93 + uVar92 + 6);
  auVar7 = vpmovsxwd_avx(auVar11);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar105);
  auVar179._0_4_ = auVar100._0_4_ * auVar7._0_4_;
  auVar179._4_4_ = auVar100._4_4_ * auVar7._4_4_;
  auVar179._8_4_ = auVar100._8_4_ * auVar7._8_4_;
  auVar179._12_4_ = auVar100._12_4_ * auVar7._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar92 * 0x17 + 6);
  auVar7 = vpmovsxwd_avx(auVar12);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar105);
  auVar99._0_4_ = auVar100._0_4_ * auVar7._0_4_;
  auVar99._4_4_ = auVar100._4_4_ * auVar7._4_4_;
  auVar99._8_4_ = auVar100._8_4_ * auVar7._8_4_;
  auVar99._12_4_ = auVar100._12_4_ * auVar7._12_4_;
  auVar7 = vpminsd_avx(auVar203,auVar227);
  auVar8 = vpminsd_avx(auVar246,auVar138);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar8 = vpminsd_avx(auVar179,auVar99);
  uVar95 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar258._4_4_ = uVar95;
  auVar258._0_4_ = uVar95;
  auVar258._8_4_ = uVar95;
  auVar258._12_4_ = uVar95;
  auVar8 = vmaxps_avx(auVar8,auVar258);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  local_6a0._0_4_ = auVar7._0_4_ * 0.99999964;
  local_6a0._4_4_ = auVar7._4_4_ * 0.99999964;
  local_6a0._8_4_ = auVar7._8_4_ * 0.99999964;
  local_6a0._12_4_ = auVar7._12_4_ * 0.99999964;
  auVar7 = vpmaxsd_avx(auVar203,auVar227);
  auVar8 = vpmaxsd_avx(auVar246,auVar138);
  auVar7 = vminps_avx(auVar7,auVar8);
  auVar8 = vpmaxsd_avx(auVar179,auVar99);
  uVar95 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar105._4_4_ = uVar95;
  auVar105._0_4_ = uVar95;
  auVar105._8_4_ = uVar95;
  auVar105._12_4_ = uVar95;
  auVar8 = vminps_avx(auVar8,auVar105);
  auVar7 = vminps_avx(auVar7,auVar8);
  auVar100._0_4_ = auVar7._0_4_ * 1.0000004;
  auVar100._4_4_ = auVar7._4_4_ * 1.0000004;
  auVar100._8_4_ = auVar7._8_4_ * 1.0000004;
  auVar100._12_4_ = auVar7._12_4_ * 1.0000004;
  auVar139[4] = PVar2;
  auVar139._5_3_ = 0;
  auVar139[8] = PVar2;
  auVar139._9_3_ = 0;
  auVar139[0xc] = PVar2;
  auVar139._13_3_ = 0;
  auVar8 = vpcmpgtd_avx(auVar139,_DAT_01f7fcf0);
  auVar7 = vcmpps_avx(local_6a0,auVar100,2);
  auVar7 = vandps_avx(auVar7,auVar8);
  uVar85 = vmovmskps_avx(auVar7);
  if (uVar85 == 0) {
    return;
  }
  uVar85 = uVar85 & 0xff;
  auVar110._16_16_ = mm_lookupmask_ps._240_16_;
  auVar110._0_16_ = mm_lookupmask_ps._240_16_;
  local_7c0 = vblendps_avx(auVar110,ZEXT832(0) << 0x20,0x80);
  local_b28 = (undefined1 (*) [32])&local_3a0;
  iVar86 = 1 << ((uint)k & 0x1f);
  auVar111._4_4_ = iVar86;
  auVar111._0_4_ = iVar86;
  auVar111._8_4_ = iVar86;
  auVar111._12_4_ = iVar86;
  auVar111._16_4_ = iVar86;
  auVar111._20_4_ = iVar86;
  auVar111._24_4_ = iVar86;
  auVar111._28_4_ = iVar86;
  auVar172 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar110 = vpand_avx2(auVar111,auVar172);
  local_680 = vpcmpeqd_avx2(auVar110,auVar172);
  local_900 = 0x7fffffff;
  uStack_8fc = 0x7fffffff;
  uStack_8f8 = 0x7fffffff;
  uStack_8f4 = 0x7fffffff;
  uStack_8f0 = 0x7fffffff;
  uStack_8ec = 0x7fffffff;
  uStack_8e8 = 0x7fffffff;
  uStack_8e4 = 0x7fffffff;
  local_7e0 = 0x80000000;
  uStack_7dc = 0x80000000;
  uStack_7d8 = 0x80000000;
  uStack_7d4 = 0x80000000;
  fStack_7d0 = -0.0;
  fStack_7cc = -0.0;
  fStack_7c8 = -0.0;
  uStack_7c4 = 0x80000000;
  local_948 = prim;
LAB_01655c26:
  lVar90 = 0;
  uVar92 = (ulong)uVar85;
  for (uVar93 = uVar92; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
    lVar90 = lVar90 + 1;
  }
  uVar85 = *(uint *)(local_948 + 2);
  local_660 = *(uint *)(local_948 + lVar90 * 4 + 6);
  local_9e0 = (ulong)local_660;
  pGVar4 = (context->scene->geometries).items[uVar85].ptr;
  uVar93 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_9e0);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar90 = *(long *)&pGVar4[1].time_range.upper;
  auVar7 = *(undefined1 (*) [16])(lVar90 + (long)p_Var5 * uVar93);
  auVar8 = *(undefined1 (*) [16])(lVar90 + (uVar93 + 1) * (long)p_Var5);
  auVar9 = *(undefined1 (*) [16])(lVar90 + (uVar93 + 2) * (long)p_Var5);
  uVar92 = uVar92 - 1 & uVar92;
  auVar10 = *(undefined1 (*) [16])(lVar90 + (uVar93 + 3) * (long)p_Var5);
  if (uVar92 != 0) {
    uVar91 = uVar92 - 1 & uVar92;
    for (uVar93 = uVar92; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
    }
    if (uVar91 != 0) {
      for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar12 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar95 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar268._4_4_ = uVar95;
  auVar268._0_4_ = uVar95;
  auVar268._8_4_ = uVar95;
  auVar268._12_4_ = uVar95;
  fStack_890 = (float)uVar95;
  _local_8a0 = auVar268;
  fStack_88c = (float)uVar95;
  fStack_888 = (float)uVar95;
  register0x0000149c = uVar95;
  auVar271 = ZEXT3264(_local_8a0);
  uVar95 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar275._4_4_ = uVar95;
  auVar275._0_4_ = uVar95;
  auVar275._8_4_ = uVar95;
  auVar275._12_4_ = uVar95;
  fStack_870 = (float)uVar95;
  _local_880 = auVar275;
  fStack_86c = (float)uVar95;
  fStack_868 = (float)uVar95;
  register0x000014dc = uVar95;
  auVar277 = ZEXT3264(_local_880);
  auVar11 = vunpcklps_avx(auVar268,auVar275);
  fVar94 = *(float *)(ray + k * 4 + 0xc0);
  auVar278._4_4_ = fVar94;
  auVar278._0_4_ = fVar94;
  auVar278._8_4_ = fVar94;
  auVar278._12_4_ = fVar94;
  fStack_ab0 = fVar94;
  _local_ac0 = auVar278;
  fStack_aac = fVar94;
  fStack_aa8 = fVar94;
  register0x0000151c = fVar94;
  auVar282 = ZEXT3264(_local_ac0);
  local_a70 = vinsertps_avx(auVar11,auVar278,0x28);
  auVar228._0_4_ = (auVar7._0_4_ + auVar8._0_4_ + auVar9._0_4_ + auVar10._0_4_) * 0.25;
  auVar228._4_4_ = (auVar7._4_4_ + auVar8._4_4_ + auVar9._4_4_ + auVar10._4_4_) * 0.25;
  auVar228._8_4_ = (auVar7._8_4_ + auVar8._8_4_ + auVar9._8_4_ + auVar10._8_4_) * 0.25;
  auVar228._12_4_ = (auVar7._12_4_ + auVar8._12_4_ + auVar9._12_4_ + auVar10._12_4_) * 0.25;
  auVar11 = vsubps_avx(auVar228,auVar12);
  auVar11 = vdpps_avx(auVar11,local_a70,0x7f);
  local_a80 = vdpps_avx(local_a70,local_a70,0x7f);
  auVar260 = ZEXT1664(local_a80);
  auVar100 = vrcpss_avx(local_a80,local_a80);
  auVar99 = vfnmadd213ss_fma(auVar100,local_a80,ZEXT416(0x40000000));
  auVar244 = ZEXT1664(auVar99);
  local_2c0 = auVar11._0_4_ * auVar100._0_4_ * auVar99._0_4_;
  auVar236._4_4_ = local_2c0;
  auVar236._0_4_ = local_2c0;
  auVar236._8_4_ = local_2c0;
  auVar236._12_4_ = local_2c0;
  fStack_990 = local_2c0;
  _local_9a0 = auVar236;
  fStack_98c = local_2c0;
  fStack_988 = local_2c0;
  fStack_984 = local_2c0;
  auVar11 = vfmadd231ps_fma(auVar12,local_a70,auVar236);
  auVar11 = vblendps_avx(auVar11,_DAT_01f7aa10,8);
  auVar12 = vsubps_avx(auVar7,auVar11);
  auVar9 = vsubps_avx(auVar9,auVar11);
  auVar100 = vsubps_avx(auVar8,auVar11);
  auVar10 = vsubps_avx(auVar10,auVar11);
  auVar7 = vmovshdup_avx(auVar12);
  local_1e0 = auVar7._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar7 = vshufps_avx(auVar12,auVar12,0xaa);
  local_200 = auVar7._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar7 = vshufps_avx(auVar12,auVar12,0xff);
  local_220 = auVar7._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar7 = vmovshdup_avx(auVar100);
  local_4e0 = auVar7._0_8_;
  auVar7 = vshufps_avx(auVar100,auVar100,0xaa);
  local_240 = auVar7._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar7 = vshufps_avx(auVar100,auVar100,0xff);
  local_260 = auVar7._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar7 = vmovshdup_avx(auVar9);
  local_500 = auVar7._0_8_;
  auVar7 = vshufps_avx(auVar9,auVar9,0xaa);
  local_520 = auVar7._0_8_;
  auVar7 = vshufps_avx(auVar9,auVar9,0xff);
  local_540 = auVar7._0_8_;
  auVar7 = vmovshdup_avx(auVar10);
  local_560 = auVar7._0_8_;
  auVar7 = vshufps_avx(auVar10,auVar10,0xaa);
  local_580 = auVar7._0_8_;
  auVar7 = vshufps_avx(auVar10,auVar10,0xff);
  local_5a0 = auVar7._0_8_;
  auVar7 = vfmadd231ps_fma(ZEXT432((uint)(fVar94 * fVar94)),_local_880,_local_880);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),_local_8a0,_local_8a0);
  uVar95 = auVar7._0_4_;
  auVar172._4_4_ = uVar95;
  auVar172._0_4_ = uVar95;
  auVar172._8_4_ = uVar95;
  auVar172._12_4_ = uVar95;
  auVar172._16_4_ = uVar95;
  auVar172._20_4_ = uVar95;
  auVar172._24_4_ = uVar95;
  auVar172._28_4_ = uVar95;
  fVar94 = *(float *)(ray + k * 4 + 0x60);
  local_960 = ZEXT416((uint)local_2c0);
  local_2c0 = fVar94 - local_2c0;
  fStack_2bc = local_2c0;
  fStack_2b8 = local_2c0;
  fStack_2b4 = local_2c0;
  fStack_2b0 = local_2c0;
  fStack_2ac = local_2c0;
  fStack_2a8 = local_2c0;
  fStack_2a4 = local_2c0;
  local_ca4 = 1;
  uVar93 = 0;
  local_5c0 = auVar12._0_4_;
  local_2a0 = auVar100._0_4_;
  uStack_29c = local_2a0;
  uStack_298 = local_2a0;
  uStack_294 = local_2a0;
  uStack_290 = local_2a0;
  uStack_28c = local_2a0;
  uStack_288 = local_2a0;
  uStack_284 = local_2a0;
  local_5e0 = auVar9._0_4_;
  fVar130 = auVar10._0_4_;
  auVar13._4_4_ = uStack_8fc;
  auVar13._0_4_ = local_900;
  auVar13._8_4_ = uStack_8f8;
  auVar13._12_4_ = uStack_8f4;
  auVar13._16_4_ = uStack_8f0;
  auVar13._20_4_ = uStack_8ec;
  auVar13._24_4_ = uStack_8e8;
  auVar13._28_4_ = uStack_8e4;
  local_620 = vandps_avx(auVar172,auVar13);
  auVar7 = vsqrtss_avx(local_a80,local_a80);
  auVar8 = vsqrtss_avx(local_a80,local_a80);
  local_690 = ZEXT816(0x3f80000000000000);
  local_280 = auVar172;
  uStack_65c = local_660;
  uStack_658 = local_660;
  uStack_654 = local_660;
  uStack_650 = local_660;
  uStack_64c = local_660;
  uStack_648 = local_660;
  uStack_644 = local_660;
  local_640 = uVar85;
  uStack_63c = uVar85;
  uStack_638 = uVar85;
  uStack_634 = uVar85;
  uStack_630 = uVar85;
  uStack_62c = uVar85;
  uStack_628 = uVar85;
  uStack_624 = uVar85;
  local_600 = fVar130;
  fStack_5fc = fVar130;
  fStack_5f8 = fVar130;
  fStack_5f4 = fVar130;
  fStack_5f0 = fVar130;
  fStack_5ec = fVar130;
  fStack_5e8 = fVar130;
  fStack_5e4 = fVar130;
  uStack_5dc = local_5e0;
  uStack_5d8 = local_5e0;
  uStack_5d4 = local_5e0;
  uStack_5d0 = local_5e0;
  uStack_5cc = local_5e0;
  uStack_5c8 = local_5e0;
  uStack_5c4 = local_5e0;
  uStack_5bc = local_5c0;
  uStack_5b8 = local_5c0;
  uStack_5b4 = local_5c0;
  uStack_5b0 = local_5c0;
  uStack_5ac = local_5c0;
  uStack_5a8 = local_5c0;
  uStack_5a4 = local_5c0;
  uStack_598 = local_5a0;
  uStack_590 = local_5a0;
  uStack_588 = local_5a0;
  uStack_578 = local_580;
  uStack_570 = local_580;
  uStack_568 = local_580;
  uStack_558 = local_560;
  uStack_550 = local_560;
  uStack_548 = local_560;
  uStack_538 = local_540;
  uStack_530 = local_540;
  uStack_528 = local_540;
  uStack_518 = local_520;
  uStack_510 = local_520;
  uStack_508 = local_520;
  uStack_4f8 = local_500;
  uStack_4f0 = local_500;
  uStack_4e8 = local_500;
  uStack_4d8 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4c8 = local_4e0;
  do {
    iVar86 = (int)uVar93;
    auVar11 = vmovshdup_avx(local_690);
    auVar11 = vsubps_avx(auVar11,local_690);
    local_860._0_4_ = auVar11._0_4_;
    fVar223 = local_860._0_4_ * 0.04761905;
    uVar95 = local_690._0_4_;
    local_840._4_4_ = uVar95;
    local_840._0_4_ = uVar95;
    local_840._8_4_ = uVar95;
    local_840._12_4_ = uVar95;
    local_840._16_4_ = uVar95;
    local_840._20_4_ = uVar95;
    local_840._24_4_ = uVar95;
    local_840._28_4_ = uVar95;
    local_860._4_4_ = local_860._0_4_;
    local_860._8_4_ = local_860._0_4_;
    local_860._12_4_ = local_860._0_4_;
    local_860._16_4_ = local_860._0_4_;
    local_860._20_4_ = local_860._0_4_;
    local_860._24_4_ = local_860._0_4_;
    local_860._28_4_ = local_860._0_4_;
    auVar11 = vfmadd231ps_fma(local_840,local_860,_DAT_01faff20);
    auVar112._8_4_ = 0x3f800000;
    auVar112._0_8_ = 0x3f8000003f800000;
    auVar112._12_4_ = 0x3f800000;
    auVar112._16_4_ = 0x3f800000;
    auVar112._20_4_ = 0x3f800000;
    auVar112._24_4_ = 0x3f800000;
    auVar112._28_4_ = 0x3f800000;
    auVar110 = vsubps_avx(auVar112,ZEXT1632(auVar11));
    fVar201 = auVar110._0_4_;
    fVar219 = auVar110._4_4_;
    fVar218 = auVar110._8_4_;
    fVar256 = auVar110._12_4_;
    fVar220 = auVar110._16_4_;
    fVar273 = auVar110._20_4_;
    fVar224 = auVar110._24_4_;
    fVar96 = fVar201 * fVar201 * fVar201;
    fVar131 = fVar219 * fVar219 * fVar219;
    fVar132 = fVar218 * fVar218 * fVar218;
    fVar133 = fVar256 * fVar256 * fVar256;
    fVar134 = fVar220 * fVar220 * fVar220;
    fVar135 = fVar273 * fVar273 * fVar273;
    fVar136 = fVar224 * fVar224 * fVar224;
    fVar216 = auVar11._0_4_;
    fVar222 = auVar11._4_4_;
    fVar217 = auVar11._8_4_;
    fVar221 = auVar11._12_4_;
    fVar155 = fVar216 * fVar216 * fVar216;
    fVar176 = fVar222 * fVar222 * fVar222;
    fVar177 = fVar217 * fVar217 * fVar217;
    fVar178 = fVar221 * fVar221 * fVar221;
    fVar257 = fVar201 * fVar216;
    fVar261 = fVar219 * fVar222;
    fVar262 = fVar218 * fVar217;
    fVar263 = fVar256 * fVar221;
    fVar264 = fVar220 * 0.0;
    fVar265 = fVar273 * 0.0;
    fVar266 = fVar224 * 0.0;
    fVar272 = auVar271._28_4_ + auVar282._28_4_;
    auVar15._4_4_ = fVar131 * 0.16666667;
    auVar15._0_4_ = fVar96 * 0.16666667;
    auVar15._8_4_ = fVar132 * 0.16666667;
    auVar15._12_4_ = fVar133 * 0.16666667;
    auVar15._16_4_ = fVar134 * 0.16666667;
    auVar15._20_4_ = fVar135 * 0.16666667;
    auVar15._24_4_ = fVar136 * 0.16666667;
    auVar15._28_4_ = fVar272 + 1.0;
    auVar120._4_4_ =
         (fVar219 * fVar261 * 12.0 + fVar261 * fVar222 * 6.0 + fVar176 + fVar131 * 4.0) * 0.16666667
    ;
    auVar120._0_4_ =
         (fVar201 * fVar257 * 12.0 + fVar257 * fVar216 * 6.0 + fVar155 + fVar96 * 4.0) * 0.16666667;
    auVar120._8_4_ =
         (fVar218 * fVar262 * 12.0 + fVar262 * fVar217 * 6.0 + fVar177 + fVar132 * 4.0) * 0.16666667
    ;
    auVar120._12_4_ =
         (fVar256 * fVar263 * 12.0 + fVar263 * fVar221 * 6.0 + fVar178 + fVar133 * 4.0) * 0.16666667
    ;
    auVar120._16_4_ =
         (fVar220 * fVar264 * 12.0 + fVar264 * 0.0 * 6.0 + fVar134 * 4.0 + 0.0) * 0.16666667;
    auVar120._20_4_ =
         (fVar273 * fVar265 * 12.0 + fVar265 * 0.0 * 6.0 + fVar135 * 4.0 + 0.0) * 0.16666667;
    auVar120._24_4_ =
         (fVar224 * fVar266 * 12.0 + fVar266 * 0.0 * 6.0 + fVar136 * 4.0 + 0.0) * 0.16666667;
    auVar120._28_4_ = auVar277._28_4_;
    auVar16._4_4_ =
         (fVar176 * 4.0 + fVar131 + fVar261 * fVar222 * 12.0 + fVar219 * fVar261 * 6.0) * 0.16666667
    ;
    auVar16._0_4_ =
         (fVar155 * 4.0 + fVar96 + fVar257 * fVar216 * 12.0 + fVar201 * fVar257 * 6.0) * 0.16666667;
    auVar16._8_4_ =
         (fVar177 * 4.0 + fVar132 + fVar262 * fVar217 * 12.0 + fVar218 * fVar262 * 6.0) * 0.16666667
    ;
    auVar16._12_4_ =
         (fVar178 * 4.0 + fVar133 + fVar263 * fVar221 * 12.0 + fVar256 * fVar263 * 6.0) * 0.16666667
    ;
    auVar16._16_4_ = (fVar134 + 0.0 + fVar264 * 0.0 * 12.0 + fVar220 * fVar264 * 6.0) * 0.16666667;
    auVar16._20_4_ = (fVar135 + 0.0 + fVar265 * 0.0 * 12.0 + fVar273 * fVar265 * 6.0) * 0.16666667;
    auVar16._24_4_ = (fVar136 + 0.0 + fVar266 * 0.0 * 12.0 + fVar224 * fVar266 * 6.0) * 0.16666667;
    auVar16._28_4_ = auVar282._28_4_;
    fVar155 = fVar155 * 0.16666667;
    fVar176 = fVar176 * 0.16666667;
    fVar177 = fVar177 * 0.16666667;
    fVar178 = fVar178 * 0.16666667;
    auVar115._4_4_ = fVar176 * fStack_5fc;
    auVar115._0_4_ = fVar155 * local_600;
    auVar115._8_4_ = fVar177 * fStack_5f8;
    auVar115._12_4_ = fVar178 * fStack_5f4;
    auVar115._16_4_ = fStack_5f0 * 0.0;
    auVar115._20_4_ = fStack_5ec * 0.0;
    auVar115._24_4_ = fStack_5e8 * 0.0;
    auVar115._28_4_ = 0x3f800000;
    auVar17._4_4_ = fVar176 * local_560._4_4_;
    auVar17._0_4_ = fVar155 * (float)local_560;
    auVar17._8_4_ = fVar177 * (float)uStack_558;
    auVar17._12_4_ = fVar178 * uStack_558._4_4_;
    auVar17._16_4_ = (float)uStack_550 * 0.0;
    auVar17._20_4_ = uStack_550._4_4_ * 0.0;
    auVar17._24_4_ = (float)uStack_548 * 0.0;
    auVar17._28_4_ = fVar272 + DAT_01faff20._28_4_ + 0.0;
    auVar148._4_4_ = fVar176 * local_580._4_4_;
    auVar148._0_4_ = fVar155 * (float)local_580;
    auVar148._8_4_ = fVar177 * (float)uStack_578;
    auVar148._12_4_ = fVar178 * uStack_578._4_4_;
    auVar148._16_4_ = (float)uStack_570 * 0.0;
    auVar148._20_4_ = uStack_570._4_4_ * 0.0;
    auVar148._24_4_ = (float)uStack_568 * 0.0;
    auVar148._28_4_ = 0;
    auVar18._4_4_ = fVar176 * local_5a0._4_4_;
    auVar18._0_4_ = fVar155 * (float)local_5a0;
    auVar18._8_4_ = fVar177 * (float)uStack_598;
    auVar18._12_4_ = fVar178 * uStack_598._4_4_;
    auVar18._16_4_ = (float)uStack_590 * 0.0;
    auVar18._20_4_ = uStack_590._4_4_ * 0.0;
    auVar18._24_4_ = (float)uStack_588 * 0.0;
    auVar18._28_4_ = 0x3e2aaaab;
    auVar113._4_4_ = uStack_5dc;
    auVar113._0_4_ = local_5e0;
    auVar113._8_4_ = uStack_5d8;
    auVar113._12_4_ = uStack_5d4;
    auVar113._16_4_ = uStack_5d0;
    auVar113._20_4_ = uStack_5cc;
    auVar113._24_4_ = uStack_5c8;
    auVar113._28_4_ = uStack_5c4;
    auVar11 = vfmadd231ps_fma(auVar115,auVar16,auVar113);
    auVar72._8_8_ = uStack_4f8;
    auVar72._0_8_ = local_500;
    auVar72._16_8_ = uStack_4f0;
    auVar72._24_8_ = uStack_4e8;
    auVar99 = vfmadd231ps_fma(auVar17,auVar16,auVar72);
    auVar70._8_8_ = uStack_518;
    auVar70._0_8_ = local_520;
    auVar70._16_8_ = uStack_510;
    auVar70._24_8_ = uStack_508;
    auVar105 = vfmadd231ps_fma(auVar148,auVar16,auVar70);
    auVar68._8_8_ = uStack_538;
    auVar68._0_8_ = local_540;
    auVar68._16_8_ = uStack_530;
    auVar68._24_8_ = uStack_528;
    auVar138 = vfmadd231ps_fma(auVar18,auVar16,auVar68);
    auVar79._4_4_ = uStack_29c;
    auVar79._0_4_ = local_2a0;
    auVar79._8_4_ = uStack_298;
    auVar79._12_4_ = uStack_294;
    auVar79._16_4_ = uStack_290;
    auVar79._20_4_ = uStack_28c;
    auVar79._24_4_ = uStack_288;
    auVar79._28_4_ = uStack_284;
    auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar120,auVar79);
    auVar74._8_8_ = uStack_4d8;
    auVar74._0_8_ = local_4e0;
    auVar74._16_8_ = uStack_4d0;
    auVar74._24_8_ = uStack_4c8;
    auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar120,auVar74);
    auVar81._8_8_ = uStack_238;
    auVar81._0_8_ = local_240;
    auVar81._16_8_ = uStack_230;
    auVar81._24_8_ = uStack_228;
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar120,auVar81);
    auVar80._8_8_ = uStack_258;
    auVar80._0_8_ = local_260;
    auVar80._16_8_ = uStack_250;
    auVar80._24_8_ = uStack_248;
    auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),auVar80,auVar120);
    auVar66._4_4_ = uStack_5bc;
    auVar66._0_4_ = local_5c0;
    auVar66._8_4_ = uStack_5b8;
    auVar66._12_4_ = uStack_5b4;
    auVar66._16_4_ = uStack_5b0;
    auVar66._20_4_ = uStack_5ac;
    auVar66._24_4_ = uStack_5a8;
    auVar66._28_4_ = uStack_5a4;
    auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar15,auVar66);
    auVar113 = ZEXT1632(auVar11);
    auVar84._8_8_ = uStack_1d8;
    auVar84._0_8_ = local_1e0;
    auVar84._16_8_ = uStack_1d0;
    auVar84._24_8_ = uStack_1c8;
    auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar15,auVar84);
    local_a00 = ZEXT1632(auVar99);
    auVar83._8_8_ = uStack_1f8;
    auVar83._0_8_ = local_200;
    auVar83._16_8_ = uStack_1f0;
    auVar83._24_8_ = uStack_1e8;
    auVar11 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar15,auVar83);
    auVar82._8_8_ = uStack_218;
    auVar82._0_8_ = local_220;
    auVar82._16_8_ = uStack_210;
    auVar82._24_8_ = uStack_208;
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar138),auVar82,auVar15);
    auVar237._0_4_ = (float)((uint)fVar216 ^ local_7e0) * fVar216;
    auVar237._4_4_ = (float)((uint)fVar222 ^ uStack_7dc) * fVar222;
    auVar237._8_4_ = (float)((uint)fVar217 ^ uStack_7d8) * fVar217;
    auVar237._12_4_ = (float)((uint)fVar221 ^ uStack_7d4) * fVar221;
    auVar237._16_4_ = fStack_7d0 * 0.0;
    auVar237._20_4_ = fStack_7cc * 0.0;
    auVar237._24_4_ = fStack_7c8 * 0.0;
    auVar237._28_4_ = 0;
    auVar19._4_4_ = fVar261 * 4.0;
    auVar19._0_4_ = fVar257 * 4.0;
    auVar19._8_4_ = fVar262 * 4.0;
    auVar19._12_4_ = fVar263 * 4.0;
    auVar19._16_4_ = fVar264 * 4.0;
    auVar19._20_4_ = fVar265 * 4.0;
    fVar96 = auVar260._28_4_;
    auVar19._24_4_ = fVar266 * 4.0;
    auVar19._28_4_ = fVar96;
    auVar111 = vsubps_avx(auVar237,auVar19);
    auVar20._4_4_ = fVar219 * (float)((uint)fVar219 ^ uStack_7dc) * 0.5;
    auVar20._0_4_ = fVar201 * (float)((uint)fVar201 ^ local_7e0) * 0.5;
    auVar20._8_4_ = fVar218 * (float)((uint)fVar218 ^ uStack_7d8) * 0.5;
    auVar20._12_4_ = fVar256 * (float)((uint)fVar256 ^ uStack_7d4) * 0.5;
    auVar20._16_4_ = fVar220 * (float)((uint)fVar220 ^ (uint)fStack_7d0) * 0.5;
    auVar20._20_4_ = fVar273 * (float)((uint)fVar273 ^ (uint)fStack_7cc) * 0.5;
    auVar20._24_4_ = fVar224 * (float)((uint)fVar224 ^ (uint)fStack_7c8) * 0.5;
    auVar20._28_4_ = auVar110._28_4_;
    auVar116._4_4_ = auVar111._4_4_ * 0.5;
    auVar116._0_4_ = auVar111._0_4_ * 0.5;
    auVar116._8_4_ = auVar111._8_4_ * 0.5;
    auVar116._12_4_ = auVar111._12_4_ * 0.5;
    auVar116._16_4_ = auVar111._16_4_ * 0.5;
    auVar116._20_4_ = auVar111._20_4_ * 0.5;
    auVar116._24_4_ = auVar111._24_4_ * 0.5;
    auVar116._28_4_ = auVar111._28_4_;
    auVar166._4_4_ = (fVar261 * 4.0 + fVar219 * fVar219) * 0.5;
    auVar166._0_4_ = (fVar257 * 4.0 + fVar201 * fVar201) * 0.5;
    auVar166._8_4_ = (fVar262 * 4.0 + fVar218 * fVar218) * 0.5;
    auVar166._12_4_ = (fVar263 * 4.0 + fVar256 * fVar256) * 0.5;
    auVar166._16_4_ = (fVar264 * 4.0 + fVar220 * fVar220) * 0.5;
    auVar166._20_4_ = (fVar265 * 4.0 + fVar273 * fVar273) * 0.5;
    auVar166._24_4_ = (fVar266 * 4.0 + fVar224 * fVar224) * 0.5;
    auVar166._28_4_ = fVar96 + auVar244._28_4_;
    fVar201 = fVar216 * fVar216 * 0.5;
    fVar216 = fVar222 * fVar222 * 0.5;
    fVar219 = fVar217 * fVar217 * 0.5;
    fVar222 = fVar221 * fVar221 * 0.5;
    auVar276._4_4_ = fVar216 * fStack_5fc;
    auVar276._0_4_ = fVar201 * local_600;
    auVar276._8_4_ = fVar219 * fStack_5f8;
    auVar276._12_4_ = fVar222 * fStack_5f4;
    auVar276._16_4_ = fStack_5f0 * 0.0;
    auVar276._20_4_ = fStack_5ec * 0.0;
    auVar276._24_4_ = fStack_5e8 * 0.0;
    auVar276._28_4_ = fVar96;
    auVar294._4_4_ = fVar216 * local_560._4_4_;
    auVar294._0_4_ = fVar201 * (float)local_560;
    auVar294._8_4_ = fVar219 * (float)uStack_558;
    auVar294._12_4_ = fVar222 * uStack_558._4_4_;
    auVar294._16_4_ = (float)uStack_550 * 0.0;
    auVar294._20_4_ = uStack_550._4_4_ * 0.0;
    auVar294._24_4_ = (float)uStack_548 * 0.0;
    auVar294._28_4_ = uStack_7c4;
    auVar296._4_4_ = fVar216 * local_580._4_4_;
    auVar296._0_4_ = fVar201 * (float)local_580;
    auVar296._8_4_ = fVar219 * (float)uStack_578;
    auVar296._12_4_ = fVar222 * uStack_578._4_4_;
    auVar296._16_4_ = (float)uStack_570 * 0.0;
    auVar296._20_4_ = uStack_570._4_4_ * 0.0;
    auVar296._24_4_ = (float)uStack_568 * 0.0;
    auVar296._28_4_ = auVar277._28_4_;
    auVar214._4_4_ = fVar216 * local_5a0._4_4_;
    auVar214._0_4_ = fVar201 * (float)local_5a0;
    auVar214._8_4_ = fVar219 * (float)uStack_598;
    auVar214._12_4_ = fVar222 * uStack_598._4_4_;
    auVar214._16_4_ = (float)uStack_590 * 0.0;
    auVar214._20_4_ = uStack_590._4_4_ * 0.0;
    auVar214._24_4_ = (float)uStack_588 * 0.0;
    auVar214._28_4_ = auVar172._28_4_;
    auVar65._4_4_ = uStack_5dc;
    auVar65._0_4_ = local_5e0;
    auVar65._8_4_ = uStack_5d8;
    auVar65._12_4_ = uStack_5d4;
    auVar65._16_4_ = uStack_5d0;
    auVar65._20_4_ = uStack_5cc;
    auVar65._24_4_ = uStack_5c8;
    auVar65._28_4_ = uStack_5c4;
    auVar138 = vfmadd231ps_fma(auVar276,auVar166,auVar65);
    auVar73._8_8_ = uStack_4f8;
    auVar73._0_8_ = local_500;
    auVar73._16_8_ = uStack_4f0;
    auVar73._24_8_ = uStack_4e8;
    auVar98 = vfmadd231ps_fma(auVar294,auVar166,auVar73);
    auVar71._8_8_ = uStack_518;
    auVar71._0_8_ = local_520;
    auVar71._16_8_ = uStack_510;
    auVar71._24_8_ = uStack_508;
    auVar139 = vfmadd231ps_fma(auVar296,auVar166,auVar71);
    auVar69._8_8_ = uStack_538;
    auVar69._0_8_ = local_540;
    auVar69._16_8_ = uStack_530;
    auVar69._24_8_ = uStack_528;
    auVar179 = vfmadd231ps_fma(auVar214,auVar166,auVar69);
    auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),auVar116,auVar79);
    auVar75._8_8_ = uStack_4d8;
    auVar75._0_8_ = local_4e0;
    auVar75._16_8_ = uStack_4d0;
    auVar75._24_8_ = uStack_4c8;
    auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar116,auVar75);
    auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar116,auVar81);
    auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar80,auVar116);
    auVar67._4_4_ = uStack_5bc;
    auVar67._0_4_ = local_5c0;
    auVar67._8_4_ = uStack_5b8;
    auVar67._12_4_ = uStack_5b4;
    auVar67._16_4_ = uStack_5b0;
    auVar67._20_4_ = uStack_5ac;
    auVar67._24_4_ = uStack_5a8;
    auVar67._28_4_ = uStack_5a4;
    auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),auVar20,auVar67);
    auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar20,auVar84);
    auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar20,auVar83);
    auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar82,auVar20);
    local_aa0._0_4_ = auVar138._0_4_ * fVar223;
    local_aa0._4_4_ = auVar138._4_4_ * fVar223;
    local_aa0._8_4_ = auVar138._8_4_ * fVar223;
    local_aa0._12_4_ = auVar138._12_4_ * fVar223;
    local_aa0._16_4_ = fVar223 * 0.0;
    local_aa0._20_4_ = fVar223 * 0.0;
    local_aa0._24_4_ = fVar223 * 0.0;
    local_aa0._28_4_ = 0;
    fVar201 = auVar98._0_4_ * fVar223;
    fVar216 = auVar98._4_4_ * fVar223;
    auVar22._4_4_ = fVar216;
    auVar22._0_4_ = fVar201;
    fVar219 = auVar98._8_4_ * fVar223;
    auVar22._8_4_ = fVar219;
    fVar222 = auVar98._12_4_ * fVar223;
    auVar22._12_4_ = fVar222;
    auVar22._16_4_ = fVar223 * 0.0;
    auVar22._20_4_ = fVar223 * 0.0;
    auVar22._24_4_ = fVar223 * 0.0;
    auVar22._28_4_ = (int)((ulong)uStack_208 >> 0x20);
    fVar133 = auVar139._0_4_ * fVar223;
    fVar134 = auVar139._4_4_ * fVar223;
    local_ae0._4_4_ = fVar134;
    local_ae0._0_4_ = fVar133;
    fVar135 = auVar139._8_4_ * fVar223;
    local_ae0._8_4_ = fVar135;
    fVar136 = auVar139._12_4_ * fVar223;
    local_ae0._12_4_ = fVar136;
    fVar155 = fVar223 * 0.0;
    local_ae0._16_4_ = fVar155;
    fVar176 = fVar223 * 0.0;
    local_ae0._20_4_ = fVar176;
    fVar177 = fVar223 * 0.0;
    local_ae0._24_4_ = fVar177;
    local_ae0._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    auVar212._0_4_ = fVar223 * auVar179._0_4_;
    auVar212._4_4_ = fVar223 * auVar179._4_4_;
    auVar212._8_4_ = fVar223 * auVar179._8_4_;
    auVar212._12_4_ = fVar223 * auVar179._12_4_;
    auVar212._16_4_ = fVar223 * 0.0;
    auVar212._20_4_ = fVar223 * 0.0;
    auVar212._24_4_ = fVar223 * 0.0;
    auVar212._28_4_ = 0;
    local_b60 = vpermps_avx2(_DAT_01fec480,auVar113);
    local_820 = vpermps_avx2(_DAT_01fec480,local_a00);
    auVar166 = ZEXT1632(auVar11);
    local_b80 = vpermps_avx2(_DAT_01fec480,auVar166);
    auVar15 = vsubps_avx(local_b60,auVar113);
    auVar120 = vsubps_avx(local_b80,ZEXT1632(auVar11));
    fVar221 = auVar120._0_4_;
    fVar220 = auVar120._4_4_;
    auVar14._4_4_ = fVar220 * local_aa0._4_4_;
    auVar14._0_4_ = fVar221 * (float)local_aa0._0_4_;
    fVar224 = auVar120._8_4_;
    auVar14._8_4_ = fVar224 * local_aa0._8_4_;
    fVar96 = auVar120._12_4_;
    auVar14._12_4_ = fVar96 * local_aa0._12_4_;
    fVar131 = auVar120._16_4_;
    auVar14._16_4_ = fVar131 * local_aa0._16_4_;
    fVar132 = auVar120._20_4_;
    auVar14._20_4_ = fVar132 * local_aa0._20_4_;
    fVar178 = auVar120._24_4_;
    auVar14._24_4_ = fVar178 * local_aa0._24_4_;
    auVar14._28_4_ = local_b60._28_4_;
    auVar11 = vfmsub231ps_fma(auVar14,local_ae0,auVar15);
    auVar16 = vsubps_avx(local_820,local_a00);
    fVar265 = auVar15._0_4_;
    fVar266 = auVar15._4_4_;
    auVar23._4_4_ = fVar266 * fVar216;
    auVar23._0_4_ = fVar265 * fVar201;
    fVar272 = auVar15._8_4_;
    auVar23._8_4_ = fVar272 * fVar219;
    fVar283 = auVar15._12_4_;
    auVar23._12_4_ = fVar283 * fVar222;
    fVar284 = auVar15._16_4_;
    auVar23._16_4_ = fVar284 * fVar223 * 0.0;
    fVar285 = auVar15._20_4_;
    auVar23._20_4_ = fVar285 * fVar223 * 0.0;
    fVar286 = auVar15._24_4_;
    auVar23._24_4_ = fVar286 * fVar223 * 0.0;
    auVar23._28_4_ = local_b80._28_4_;
    auVar138 = vfmsub231ps_fma(auVar23,local_aa0,auVar16);
    auVar11 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar138._12_4_ * auVar138._12_4_,
                                                 CONCAT48(auVar138._8_4_ * auVar138._8_4_,
                                                          CONCAT44(auVar138._4_4_ * auVar138._4_4_,
                                                                   auVar138._0_4_ * auVar138._0_4_))
                                                )),ZEXT1632(auVar11),ZEXT1632(auVar11));
    fVar273 = auVar16._0_4_;
    fVar223 = auVar16._4_4_;
    auVar24._4_4_ = fVar223 * fVar134;
    auVar24._0_4_ = fVar273 * fVar133;
    fVar257 = auVar16._8_4_;
    auVar24._8_4_ = fVar257 * fVar135;
    fVar261 = auVar16._12_4_;
    auVar24._12_4_ = fVar261 * fVar136;
    fVar262 = auVar16._16_4_;
    auVar24._16_4_ = fVar262 * fVar155;
    fVar263 = auVar16._20_4_;
    auVar24._20_4_ = fVar263 * fVar176;
    fVar264 = auVar16._24_4_;
    auVar24._24_4_ = fVar264 * fVar177;
    auVar24._28_4_ = 0;
    auVar98 = vfmsub231ps_fma(auVar24,auVar22,auVar120);
    auVar194._0_4_ = fVar221 * fVar221;
    auVar194._4_4_ = fVar220 * fVar220;
    auVar194._8_4_ = fVar224 * fVar224;
    auVar194._12_4_ = fVar96 * fVar96;
    auVar194._16_4_ = fVar131 * fVar131;
    auVar194._20_4_ = fVar132 * fVar132;
    auVar194._24_4_ = fVar178 * fVar178;
    auVar194._28_4_ = 0;
    auVar138 = vfmadd231ps_fma(auVar194,auVar16,auVar16);
    auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),auVar15,auVar15);
    auVar110 = vrcpps_avx(ZEXT1632(auVar138));
    auVar98 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar98),ZEXT1632(auVar98));
    auVar233._8_4_ = 0x3f800000;
    auVar233._0_8_ = 0x3f8000003f800000;
    auVar233._12_4_ = 0x3f800000;
    auVar233._16_4_ = 0x3f800000;
    auVar233._20_4_ = 0x3f800000;
    auVar233._24_4_ = 0x3f800000;
    auVar233._28_4_ = 0x3f800000;
    auVar11 = vfnmadd213ps_fma(auVar110,ZEXT1632(auVar138),auVar233);
    auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar110,auVar110);
    auVar18 = vpermps_avx2(_DAT_01fec480,local_aa0);
    local_b00 = vpermps_avx2(_DAT_01fec480,local_ae0);
    auVar25._4_4_ = fVar220 * auVar18._4_4_;
    auVar25._0_4_ = fVar221 * auVar18._0_4_;
    auVar25._8_4_ = fVar224 * auVar18._8_4_;
    auVar25._12_4_ = fVar96 * auVar18._12_4_;
    auVar25._16_4_ = fVar131 * auVar18._16_4_;
    auVar25._20_4_ = fVar132 * auVar18._20_4_;
    auVar25._24_4_ = fVar178 * auVar18._24_4_;
    auVar25._28_4_ = auVar110._28_4_;
    auVar139 = vfmsub231ps_fma(auVar25,local_b00,auVar15);
    local_9c0 = vpermps_avx2(_DAT_01fec480,auVar22);
    auVar26._4_4_ = fVar266 * local_9c0._4_4_;
    auVar26._0_4_ = fVar265 * local_9c0._0_4_;
    auVar26._8_4_ = fVar272 * local_9c0._8_4_;
    auVar26._12_4_ = fVar283 * local_9c0._12_4_;
    auVar26._16_4_ = fVar284 * local_9c0._16_4_;
    auVar26._20_4_ = fVar285 * local_9c0._20_4_;
    auVar26._24_4_ = fVar286 * local_9c0._24_4_;
    auVar26._28_4_ = 0;
    auVar179 = vfmsub231ps_fma(auVar26,auVar18,auVar16);
    auVar139 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar179._12_4_ * auVar179._12_4_,
                                                  CONCAT48(auVar179._8_4_ * auVar179._8_4_,
                                                           CONCAT44(auVar179._4_4_ * auVar179._4_4_,
                                                                    auVar179._0_4_ * auVar179._0_4_)
                                                          ))),ZEXT1632(auVar139),ZEXT1632(auVar139))
    ;
    auVar248._0_4_ = fVar273 * local_b00._0_4_;
    auVar248._4_4_ = fVar223 * local_b00._4_4_;
    auVar248._8_4_ = fVar257 * local_b00._8_4_;
    auVar248._12_4_ = fVar261 * local_b00._12_4_;
    auVar248._16_4_ = fVar262 * local_b00._16_4_;
    auVar248._20_4_ = fVar263 * local_b00._20_4_;
    auVar248._24_4_ = fVar264 * local_b00._24_4_;
    auVar248._28_4_ = 0;
    auVar179 = vfmsub231ps_fma(auVar248,local_9c0,auVar120);
    auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),ZEXT1632(auVar179),ZEXT1632(auVar179));
    auVar110 = vmaxps_avx(ZEXT1632(CONCAT412(auVar98._12_4_ * auVar11._12_4_,
                                             CONCAT48(auVar98._8_4_ * auVar11._8_4_,
                                                      CONCAT44(auVar98._4_4_ * auVar11._4_4_,
                                                               auVar98._0_4_ * auVar11._0_4_)))),
                          ZEXT1632(CONCAT412(auVar139._12_4_ * auVar11._12_4_,
                                             CONCAT48(auVar139._8_4_ * auVar11._8_4_,
                                                      CONCAT44(auVar139._4_4_ * auVar11._4_4_,
                                                               auVar139._0_4_ * auVar11._0_4_)))));
    auVar234._0_4_ = auVar105._0_4_ + auVar212._0_4_;
    auVar234._4_4_ = auVar105._4_4_ + auVar212._4_4_;
    auVar234._8_4_ = auVar105._8_4_ + auVar212._8_4_;
    auVar234._12_4_ = auVar105._12_4_ + auVar212._12_4_;
    auVar234._16_4_ = auVar212._16_4_ + 0.0;
    auVar234._20_4_ = auVar212._20_4_ + 0.0;
    auVar234._24_4_ = auVar212._24_4_ + 0.0;
    auVar234._28_4_ = 0;
    auVar294 = ZEXT1632(auVar105);
    auVar172 = vsubps_avx(auVar294,auVar212);
    auVar19 = vpermps_avx2(_DAT_01fec480,auVar172);
    auVar20 = vpermps_avx2(_DAT_01fec480,auVar294);
    auVar172 = vmaxps_avx(auVar294,auVar234);
    auVar111 = vmaxps_avx(auVar19,auVar20);
    auVar13 = vrsqrtps_avx(ZEXT1632(auVar138));
    auVar172 = vmaxps_avx(auVar172,auVar111);
    fVar201 = auVar13._0_4_;
    fVar216 = auVar13._4_4_;
    fVar219 = auVar13._8_4_;
    fVar222 = auVar13._12_4_;
    fVar218 = auVar13._16_4_;
    fVar217 = auVar13._20_4_;
    fVar256 = auVar13._24_4_;
    auVar27._4_4_ = fVar216 * fVar216 * fVar216 * auVar138._4_4_ * -0.5;
    auVar27._0_4_ = fVar201 * fVar201 * fVar201 * auVar138._0_4_ * -0.5;
    auVar27._8_4_ = fVar219 * fVar219 * fVar219 * auVar138._8_4_ * -0.5;
    auVar27._12_4_ = fVar222 * fVar222 * fVar222 * auVar138._12_4_ * -0.5;
    auVar27._16_4_ = fVar218 * fVar218 * fVar218 * -0.0;
    auVar27._20_4_ = fVar217 * fVar217 * fVar217 * -0.0;
    auVar27._24_4_ = fVar256 * fVar256 * fVar256 * -0.0;
    auVar27._28_4_ = 0;
    auVar114._8_4_ = 0x3fc00000;
    auVar114._0_8_ = 0x3fc000003fc00000;
    auVar114._12_4_ = 0x3fc00000;
    auVar114._16_4_ = 0x3fc00000;
    auVar114._20_4_ = 0x3fc00000;
    auVar114._24_4_ = 0x3fc00000;
    auVar114._28_4_ = 0x3fc00000;
    auVar11 = vfmadd231ps_fma(auVar27,auVar114,auVar13);
    fVar216 = auVar11._0_4_;
    fVar222 = auVar11._4_4_;
    auVar28._4_4_ = fVar223 * fVar222;
    auVar28._0_4_ = fVar273 * fVar216;
    fVar256 = auVar11._8_4_;
    auVar28._8_4_ = fVar257 * fVar256;
    fVar273 = auVar11._12_4_;
    auVar28._12_4_ = fVar261 * fVar273;
    auVar28._16_4_ = fVar262 * 0.0;
    auVar28._20_4_ = fVar263 * 0.0;
    auVar28._24_4_ = fVar264 * 0.0;
    auVar28._28_4_ = 0;
    auVar29._4_4_ = (float)local_ac0._4_4_ * fVar220 * fVar222;
    auVar29._0_4_ = (float)local_ac0._0_4_ * fVar221 * fVar216;
    auVar29._8_4_ = fStack_ab8 * fVar224 * fVar256;
    auVar29._12_4_ = fStack_ab4 * fVar96 * fVar273;
    auVar29._16_4_ = fStack_ab0 * fVar131 * 0.0;
    auVar29._20_4_ = fStack_aac * fVar132 * 0.0;
    auVar29._24_4_ = fStack_aa8 * fVar178 * 0.0;
    auVar29._28_4_ = auVar16._28_4_;
    auVar105 = vfmadd231ps_fma(auVar29,auVar28,_local_880);
    auVar115 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar111 = vsubps_avx(auVar115,auVar166);
    fVar219 = auVar111._0_4_;
    fVar218 = auVar111._4_4_;
    auVar30._4_4_ = fVar220 * fVar222 * fVar218;
    auVar30._0_4_ = fVar221 * fVar216 * fVar219;
    fVar221 = auVar111._8_4_;
    auVar30._8_4_ = fVar224 * fVar256 * fVar221;
    fVar224 = auVar111._12_4_;
    auVar30._12_4_ = fVar96 * fVar273 * fVar224;
    fVar96 = auVar111._16_4_;
    auVar30._16_4_ = fVar131 * 0.0 * fVar96;
    fVar131 = auVar111._20_4_;
    auVar30._20_4_ = fVar132 * 0.0 * fVar131;
    fVar132 = auVar111._24_4_;
    auVar30._24_4_ = fVar178 * 0.0 * fVar132;
    auVar30._28_4_ = local_9c0._28_4_;
    auVar115 = vsubps_avx(auVar115,local_a00);
    auVar271 = ZEXT3264(auVar115);
    auVar138 = vfmadd231ps_fma(auVar30,auVar115,auVar28);
    auVar31._4_4_ = fVar266 * fVar222;
    auVar31._0_4_ = fVar265 * fVar216;
    auVar31._8_4_ = fVar272 * fVar256;
    auVar31._12_4_ = fVar283 * fVar273;
    auVar31._16_4_ = fVar284 * 0.0;
    auVar31._20_4_ = fVar285 * 0.0;
    auVar31._24_4_ = fVar286 * 0.0;
    auVar31._28_4_ = 0;
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar31,_local_8a0);
    auVar277 = ZEXT1664(auVar105);
    auVar116 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar17 = vsubps_avx(auVar116,auVar113);
    auVar282 = ZEXT3264(auVar17);
    auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),auVar17,auVar31);
    auVar32._4_4_ = (float)local_ac0._4_4_ * fVar218;
    auVar32._0_4_ = (float)local_ac0._0_4_ * fVar219;
    auVar32._8_4_ = fStack_ab8 * fVar221;
    auVar32._12_4_ = fStack_ab4 * fVar224;
    auVar32._16_4_ = fStack_ab0 * fVar96;
    auVar32._20_4_ = fStack_aac * fVar131;
    auVar32._24_4_ = fStack_aa8 * fVar132;
    auVar32._28_4_ = 0;
    auVar98 = vfmadd231ps_fma(auVar32,_local_880,auVar115);
    auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),_local_8a0,auVar17);
    fVar201 = auVar138._0_4_;
    fVar263 = auVar105._0_4_;
    fVar217 = auVar138._4_4_;
    fVar264 = auVar105._4_4_;
    fVar220 = auVar138._8_4_;
    fVar265 = auVar105._8_4_;
    fVar223 = auVar138._12_4_;
    fVar266 = auVar105._12_4_;
    auVar33._28_4_ = auVar13._28_4_;
    auVar33._0_28_ =
         ZEXT1628(CONCAT412(fVar266 * fVar223,
                            CONCAT48(fVar265 * fVar220,CONCAT44(fVar264 * fVar217,fVar263 * fVar201)
                                    )));
    auVar148 = vsubps_avx(ZEXT1632(auVar98),auVar33);
    auVar34._4_4_ = fVar218 * fVar218;
    auVar34._0_4_ = fVar219 * fVar219;
    auVar34._8_4_ = fVar221 * fVar221;
    auVar34._12_4_ = fVar224 * fVar224;
    auVar34._16_4_ = fVar96 * fVar96;
    auVar34._20_4_ = fVar131 * fVar131;
    auVar34._24_4_ = fVar132 * fVar132;
    auVar34._28_4_ = auVar13._28_4_;
    auVar98 = vfmadd231ps_fma(auVar34,auVar115,auVar115);
    auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar17,auVar17);
    auVar13 = vsubps_avx(ZEXT1632(auVar98),
                         ZEXT1632(CONCAT412(fVar223 * fVar223,
                                            CONCAT48(fVar220 * fVar220,
                                                     CONCAT44(fVar217 * fVar217,fVar201 * fVar201)))
                                 ));
    auVar111 = vsqrtps_avx(auVar110);
    fVar262 = auVar111._28_4_ + auVar172._28_4_;
    fVar201 = (auVar111._0_4_ + auVar172._0_4_) * 1.0000002;
    fVar217 = (auVar111._4_4_ + auVar172._4_4_) * 1.0000002;
    fVar220 = (auVar111._8_4_ + auVar172._8_4_) * 1.0000002;
    fVar223 = (auVar111._12_4_ + auVar172._12_4_) * 1.0000002;
    fVar178 = (auVar111._16_4_ + auVar172._16_4_) * 1.0000002;
    fVar257 = (auVar111._20_4_ + auVar172._20_4_) * 1.0000002;
    fVar261 = (auVar111._24_4_ + auVar172._24_4_) * 1.0000002;
    auVar35._4_4_ = fVar217 * fVar217;
    auVar35._0_4_ = fVar201 * fVar201;
    auVar35._8_4_ = fVar220 * fVar220;
    auVar35._12_4_ = fVar223 * fVar223;
    auVar35._16_4_ = fVar178 * fVar178;
    auVar35._20_4_ = fVar257 * fVar257;
    auVar35._24_4_ = fVar261 * fVar261;
    auVar35._28_4_ = fVar262;
    local_a20._0_4_ = auVar148._0_4_ + auVar148._0_4_;
    local_a20._4_4_ = auVar148._4_4_ + auVar148._4_4_;
    local_a20._8_4_ = auVar148._8_4_ + auVar148._8_4_;
    local_a20._12_4_ = auVar148._12_4_ + auVar148._12_4_;
    local_a20._16_4_ = auVar148._16_4_ + auVar148._16_4_;
    local_a20._20_4_ = auVar148._20_4_ + auVar148._20_4_;
    local_a20._24_4_ = auVar148._24_4_ + auVar148._24_4_;
    fVar201 = auVar148._28_4_;
    local_a20._28_4_ = fVar201 + fVar201;
    auVar172 = vsubps_avx(auVar13,auVar35);
    auVar276 = ZEXT1632(auVar105);
    auVar36._28_4_ = 0x3f800002;
    auVar36._0_28_ =
         ZEXT1628(CONCAT412(fVar266 * fVar266,
                            CONCAT48(fVar265 * fVar265,CONCAT44(fVar264 * fVar264,fVar263 * fVar263)
                                    )));
    local_8e0 = vsubps_avx(local_280,auVar36);
    auVar260 = ZEXT3264(local_8e0);
    auVar37._4_4_ = local_a20._4_4_ * local_a20._4_4_;
    auVar37._0_4_ = (float)local_a20._0_4_ * (float)local_a20._0_4_;
    auVar37._8_4_ = local_a20._8_4_ * local_a20._8_4_;
    auVar37._12_4_ = local_a20._12_4_ * local_a20._12_4_;
    auVar37._16_4_ = local_a20._16_4_ * local_a20._16_4_;
    auVar37._20_4_ = local_a20._20_4_ * local_a20._20_4_;
    auVar37._24_4_ = local_a20._24_4_ * local_a20._24_4_;
    auVar37._28_4_ = fVar262;
    auStack_9d8 = auVar37._8_24_;
    fVar217 = local_8e0._0_4_;
    fVar220 = local_8e0._4_4_;
    fVar223 = local_8e0._8_4_;
    fVar178 = local_8e0._12_4_;
    fVar257 = local_8e0._16_4_;
    fVar261 = local_8e0._20_4_;
    fVar262 = local_8e0._24_4_;
    auVar38._4_4_ = fVar220 * 4.0 * auVar172._4_4_;
    auVar38._0_4_ = fVar217 * 4.0 * auVar172._0_4_;
    auVar38._8_4_ = fVar223 * 4.0 * auVar172._8_4_;
    auVar38._12_4_ = fVar178 * 4.0 * auVar172._12_4_;
    auVar38._16_4_ = fVar257 * 4.0 * auVar172._16_4_;
    auVar38._20_4_ = fVar261 * 4.0 * auVar172._20_4_;
    auVar38._24_4_ = fVar262 * 4.0 * auVar172._24_4_;
    auVar38._28_4_ = fVar201;
    auVar148 = vsubps_avx(auVar37,auVar38);
    auVar110 = vcmpps_avx(auVar148,auVar116,5);
    auVar296 = ZEXT1632(auVar138);
    fVar201 = local_8e0._28_4_;
    if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar110 >> 0x7f,0) == '\0') &&
          (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar110 >> 0xbf,0) == '\0') &&
        (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar110[0x1f])
    {
      auVar244 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar195._8_4_ = 0xff800000;
      auVar195._0_8_ = 0xff800000ff800000;
      auVar195._12_4_ = 0xff800000;
      auVar195._16_4_ = 0xff800000;
      auVar195._20_4_ = 0xff800000;
      auVar195._24_4_ = 0xff800000;
      auVar195._28_4_ = 0xff800000;
    }
    else {
      auVar14 = vsqrtps_avx(auVar148);
      auVar287._0_4_ = fVar217 + fVar217;
      auVar287._4_4_ = fVar220 + fVar220;
      auVar287._8_4_ = fVar223 + fVar223;
      auVar287._12_4_ = fVar178 + fVar178;
      auVar287._16_4_ = fVar257 + fVar257;
      auVar287._20_4_ = fVar261 + fVar261;
      auVar287._24_4_ = fVar262 + fVar262;
      auVar287._28_4_ = fVar201 + fVar201;
      auVar214 = vrcpps_avx(auVar287);
      auVar116 = vcmpps_avx(auVar148,auVar116,5);
      auVar117._8_4_ = 0x3f800000;
      auVar117._0_8_ = 0x3f8000003f800000;
      auVar117._12_4_ = 0x3f800000;
      auVar117._16_4_ = 0x3f800000;
      auVar117._20_4_ = 0x3f800000;
      auVar117._24_4_ = 0x3f800000;
      auVar117._28_4_ = 0x3f800000;
      auVar105 = vfnmadd213ps_fma(auVar287,auVar214,auVar117);
      auVar105 = vfmadd132ps_fma(ZEXT1632(auVar105),auVar214,auVar214);
      auVar196._0_4_ = local_a20._0_4_ ^ local_7e0;
      auVar196._4_4_ = (uint)local_a20._4_4_ ^ uStack_7dc;
      auVar196._8_4_ = (uint)local_a20._8_4_ ^ uStack_7d8;
      auVar196._12_4_ = (uint)local_a20._12_4_ ^ uStack_7d4;
      auVar196._16_4_ = (uint)local_a20._16_4_ ^ (uint)fStack_7d0;
      auVar196._20_4_ = (uint)local_a20._20_4_ ^ (uint)fStack_7cc;
      auVar196._24_4_ = (uint)local_a20._24_4_ ^ (uint)fStack_7c8;
      auVar196._28_4_ = (uint)local_a20._28_4_ ^ uStack_7c4;
      auVar148 = vsubps_avx(auVar196,auVar14);
      auVar39._4_4_ = auVar105._4_4_ * auVar148._4_4_;
      auVar39._0_4_ = auVar105._0_4_ * auVar148._0_4_;
      auVar39._8_4_ = auVar105._8_4_ * auVar148._8_4_;
      auVar39._12_4_ = auVar105._12_4_ * auVar148._12_4_;
      auVar39._16_4_ = auVar148._16_4_ * 0.0;
      auVar39._20_4_ = auVar148._20_4_ * 0.0;
      auVar39._24_4_ = auVar148._24_4_ * 0.0;
      auVar39._28_4_ = auVar148._28_4_;
      auVar148 = vsubps_avx(auVar14,local_a20);
      auVar40._4_4_ = auVar105._4_4_ * auVar148._4_4_;
      auVar40._0_4_ = auVar105._0_4_ * auVar148._0_4_;
      auVar40._8_4_ = auVar105._8_4_ * auVar148._8_4_;
      auVar40._12_4_ = auVar105._12_4_ * auVar148._12_4_;
      auVar40._16_4_ = auVar148._16_4_ * 0.0;
      auVar40._20_4_ = auVar148._20_4_ * 0.0;
      auVar40._24_4_ = auVar148._24_4_ * 0.0;
      auVar40._28_4_ = auVar148._28_4_;
      auVar105 = vfmadd213ps_fma(auVar276,auVar39,auVar296);
      local_2e0 = auVar105._0_4_ * fVar216;
      fStack_2dc = auVar105._4_4_ * fVar222;
      fStack_2d8 = auVar105._8_4_ * fVar256;
      fStack_2d4 = auVar105._12_4_ * fVar273;
      uStack_2d0 = 0;
      uStack_2cc = 0;
      uStack_2c8 = 0;
      uStack_2c4 = 0x3f800000;
      auVar60._4_4_ = uStack_8fc;
      auVar60._0_4_ = local_900;
      auVar60._8_4_ = uStack_8f8;
      auVar60._12_4_ = uStack_8f4;
      auVar60._16_4_ = uStack_8f0;
      auVar60._20_4_ = uStack_8ec;
      auVar60._24_4_ = uStack_8e8;
      auVar60._28_4_ = uStack_8e4;
      auVar148 = vandps_avx(auVar36,auVar60);
      auVar148 = vmaxps_avx(local_620,auVar148);
      auVar41._4_4_ = auVar148._4_4_ * 1.9073486e-06;
      auVar41._0_4_ = auVar148._0_4_ * 1.9073486e-06;
      auVar41._8_4_ = auVar148._8_4_ * 1.9073486e-06;
      auVar41._12_4_ = auVar148._12_4_ * 1.9073486e-06;
      auVar41._16_4_ = auVar148._16_4_ * 1.9073486e-06;
      auVar41._20_4_ = auVar148._20_4_ * 1.9073486e-06;
      auVar41._24_4_ = auVar148._24_4_ * 1.9073486e-06;
      auVar41._28_4_ = auVar148._28_4_;
      auVar148 = vandps_avx(local_8e0,auVar60);
      auVar214 = vcmpps_avx(auVar148,auVar41,1);
      auVar105 = vfmadd213ps_fma(auVar276,auVar40,auVar296);
      auVar118._8_4_ = 0x7f800000;
      auVar118._0_8_ = 0x7f8000007f800000;
      auVar118._12_4_ = 0x7f800000;
      auVar118._16_4_ = 0x7f800000;
      auVar118._20_4_ = 0x7f800000;
      auVar118._24_4_ = 0x7f800000;
      auVar118._28_4_ = 0x7f800000;
      auVar148 = vblendvps_avx(auVar118,auVar39,auVar116);
      local_300 = auVar105._0_4_ * fVar216;
      fStack_2fc = auVar105._4_4_ * fVar222;
      fStack_2f8 = auVar105._8_4_ * fVar256;
      fStack_2f4 = auVar105._12_4_ * fVar273;
      uStack_2f0 = 0;
      uStack_2ec = 0;
      uStack_2e8 = 0;
      uStack_2e4 = auVar148._28_4_;
      auVar119._8_4_ = 0xff800000;
      auVar119._0_8_ = 0xff800000ff800000;
      auVar119._12_4_ = 0xff800000;
      auVar119._16_4_ = 0xff800000;
      auVar119._20_4_ = 0xff800000;
      auVar119._24_4_ = 0xff800000;
      auVar119._28_4_ = 0xff800000;
      auVar195 = vblendvps_avx(auVar119,auVar40,auVar116);
      auVar14 = auVar116 & auVar214;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar14 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar14 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar14 >> 0x7f,0) == '\0') &&
            (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar14 >> 0xbf,0) == '\0') &&
          (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar14[0x1f])
      {
        auVar244 = ZEXT3264(auVar148);
      }
      else {
        auVar110 = vandps_avx(auVar214,auVar116);
        auVar214 = vcmpps_avx(auVar172,_DAT_01faff00,2);
        auVar129._8_4_ = 0xff800000;
        auVar129._0_8_ = 0xff800000ff800000;
        auVar129._12_4_ = 0xff800000;
        auVar129._16_4_ = 0xff800000;
        auVar129._20_4_ = 0xff800000;
        auVar129._24_4_ = 0xff800000;
        auVar129._28_4_ = 0xff800000;
        auVar153._8_4_ = 0x7f800000;
        auVar153._0_8_ = 0x7f8000007f800000;
        auVar153._12_4_ = 0x7f800000;
        auVar153._16_4_ = 0x7f800000;
        auVar153._20_4_ = 0x7f800000;
        auVar153._24_4_ = 0x7f800000;
        auVar153._28_4_ = 0x7f800000;
        auVar172 = vblendvps_avx(auVar153,auVar129,auVar214);
        auVar105 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
        auVar14 = vpmovsxwd_avx2(auVar105);
        auVar172 = vblendvps_avx(auVar148,auVar172,auVar14);
        auVar148 = vblendvps_avx(auVar129,auVar153,auVar214);
        auVar195 = vblendvps_avx(auVar195,auVar148,auVar14);
        auVar215._0_8_ = auVar110._0_8_ ^ 0xffffffffffffffff;
        auVar215._8_4_ = auVar110._8_4_ ^ 0xffffffff;
        auVar215._12_4_ = auVar110._12_4_ ^ 0xffffffff;
        auVar215._16_4_ = auVar110._16_4_ ^ 0xffffffff;
        auVar215._20_4_ = auVar110._20_4_ ^ 0xffffffff;
        auVar215._24_4_ = auVar110._24_4_ ^ 0xffffffff;
        auVar215._28_4_ = auVar110._28_4_ ^ 0xffffffff;
        auVar110 = vorps_avx(auVar214,auVar215);
        auVar244 = ZEXT3264(auVar172);
        auVar110 = vandps_avx(auVar116,auVar110);
      }
    }
    auVar172 = local_7c0 & auVar110;
    if ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar172 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar172 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar172 >> 0x7f,0) != '\0') ||
          (auVar172 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar172 >> 0xbf,0) != '\0') ||
        (auVar172 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar172[0x1f] < '\0') {
      local_320 = ZEXT1632(auVar11);
      fVar263 = *(float *)(ray + k * 4 + 0x100);
      local_6b0 = ZEXT416((uint)fVar263);
      fVar264 = fVar263 - (float)local_960._0_4_;
      auVar213._4_4_ = fVar264;
      auVar213._0_4_ = fVar264;
      auVar213._8_4_ = fVar264;
      auVar213._12_4_ = fVar264;
      auVar213._16_4_ = fVar264;
      auVar213._20_4_ = fVar264;
      auVar213._24_4_ = fVar264;
      auVar213._28_4_ = fVar264;
      auVar116 = vminps_avx(auVar213,auVar195);
      auVar42._4_4_ = fVar134 * fVar218;
      auVar42._0_4_ = fVar133 * fVar219;
      auVar42._8_4_ = fVar135 * fVar221;
      auVar42._12_4_ = fVar136 * fVar224;
      auVar42._16_4_ = fVar155 * fVar96;
      auVar42._20_4_ = fVar176 * fVar131;
      auVar42._24_4_ = fVar177 * fVar132;
      auVar42._28_4_ = fVar264;
      auVar11 = vfmadd213ps_fma(auVar115,auVar22,auVar42);
      auVar78._4_4_ = fStack_2bc;
      auVar78._0_4_ = local_2c0;
      auVar78._8_4_ = fStack_2b8;
      auVar78._12_4_ = fStack_2b4;
      auVar78._16_4_ = fStack_2b0;
      auVar78._20_4_ = fStack_2ac;
      auVar78._24_4_ = fStack_2a8;
      auVar78._28_4_ = fStack_2a4;
      auVar148 = vmaxps_avx(auVar78,auVar244._0_32_);
      auVar105 = vfmadd213ps_fma(auVar17,local_aa0,ZEXT1632(auVar11));
      auVar271._0_4_ = fVar133 * (float)local_ac0._0_4_;
      auVar271._4_4_ = fVar134 * (float)local_ac0._4_4_;
      auVar271._8_4_ = fVar135 * fStack_ab8;
      auVar271._12_4_ = fVar136 * fStack_ab4;
      auVar271._16_4_ = fVar155 * fStack_ab0;
      auVar271._20_4_ = fVar176 * fStack_aac;
      auVar271._28_36_ = auVar244._28_36_;
      auVar271._24_4_ = fVar177 * fStack_aa8;
      auVar260 = ZEXT3264(_local_880);
      auVar11 = vfmadd231ps_fma(auVar271._0_32_,_local_880,auVar22);
      auVar138 = vfmadd231ps_fma(ZEXT1632(auVar11),_local_8a0,local_aa0);
      auVar61._4_4_ = uStack_8fc;
      auVar61._0_4_ = local_900;
      auVar61._8_4_ = uStack_8f8;
      auVar61._12_4_ = uStack_8f4;
      auVar61._16_4_ = uStack_8f0;
      auVar61._20_4_ = uStack_8ec;
      auVar61._24_4_ = uStack_8e8;
      auVar61._28_4_ = uStack_8e4;
      auVar172 = vandps_avx(auVar61,ZEXT1632(auVar138));
      auVar146._8_4_ = 0x219392ef;
      auVar146._0_8_ = 0x219392ef219392ef;
      auVar146._12_4_ = 0x219392ef;
      auVar146._16_4_ = 0x219392ef;
      auVar146._20_4_ = 0x219392ef;
      auVar146._24_4_ = 0x219392ef;
      auVar146._28_4_ = 0x219392ef;
      auVar115 = vcmpps_avx(auVar172,auVar146,1);
      auVar172 = vrcpps_avx(ZEXT1632(auVar138));
      auVar288._8_4_ = 0x3f800000;
      auVar288._0_8_ = 0x3f8000003f800000;
      auVar288._12_4_ = 0x3f800000;
      auVar288._16_4_ = 0x3f800000;
      auVar288._20_4_ = 0x3f800000;
      auVar288._24_4_ = 0x3f800000;
      auVar288._28_4_ = 0x3f800000;
      auVar214 = ZEXT1632(auVar138);
      auVar11 = vfnmadd213ps_fma(auVar172,auVar214,auVar288);
      auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar172,auVar172);
      auVar289._0_4_ = auVar138._0_4_ ^ local_7e0;
      auVar289._4_4_ = auVar138._4_4_ ^ uStack_7dc;
      auVar289._8_4_ = auVar138._8_4_ ^ uStack_7d8;
      auVar289._12_4_ = auVar138._12_4_ ^ uStack_7d4;
      auVar289._16_4_ = fStack_7d0;
      auVar289._20_4_ = fStack_7cc;
      auVar289._24_4_ = fStack_7c8;
      auVar289._28_4_ = uStack_7c4;
      auVar43._4_4_ = auVar11._4_4_ * (float)(auVar105._4_4_ ^ uStack_7dc);
      auVar43._0_4_ = auVar11._0_4_ * (float)(auVar105._0_4_ ^ local_7e0);
      auVar43._8_4_ = auVar11._8_4_ * (float)(auVar105._8_4_ ^ uStack_7d8);
      auVar43._12_4_ = auVar11._12_4_ * (float)(auVar105._12_4_ ^ uStack_7d4);
      auVar43._16_4_ = fStack_7d0 * 0.0;
      auVar43._20_4_ = fStack_7cc * 0.0;
      auVar43._24_4_ = fStack_7c8 * 0.0;
      auVar43._28_4_ = uStack_7c4;
      auVar172 = vcmpps_avx(auVar214,auVar289,1);
      auVar172 = vorps_avx(auVar115,auVar172);
      auVar279._8_4_ = 0xff800000;
      auVar279._0_8_ = 0xff800000ff800000;
      auVar279._12_4_ = 0xff800000;
      auVar279._16_4_ = 0xff800000;
      auVar279._20_4_ = 0xff800000;
      auVar279._24_4_ = 0xff800000;
      auVar279._28_4_ = 0xff800000;
      auVar172 = vblendvps_avx(auVar43,auVar279,auVar172);
      auVar17 = vmaxps_avx(auVar148,auVar172);
      auVar172 = vcmpps_avx(auVar214,auVar289,6);
      auVar172 = vorps_avx(auVar115,auVar172);
      auVar290._8_4_ = 0x7f800000;
      auVar290._0_8_ = 0x7f8000007f800000;
      auVar290._12_4_ = 0x7f800000;
      auVar290._16_4_ = 0x7f800000;
      auVar290._20_4_ = 0x7f800000;
      auVar290._24_4_ = 0x7f800000;
      auVar290._28_4_ = 0x7f800000;
      auVar172 = vblendvps_avx(auVar43,auVar290,auVar172);
      auVar148 = vminps_avx(auVar116,auVar172);
      fVar219 = (float)(local_7e0 ^ (uint)local_b00._0_4_);
      fVar218 = (float)(uStack_7dc ^ (uint)local_b00._4_4_);
      fVar221 = (float)(uStack_7d8 ^ (uint)local_b00._8_4_);
      fVar224 = (float)(uStack_7d4 ^ (uint)local_b00._12_4_);
      fVar96 = (float)((uint)fStack_7d0 ^ (uint)local_b00._16_4_);
      fVar131 = (float)((uint)fStack_7cc ^ (uint)local_b00._20_4_);
      fVar132 = (float)((uint)fStack_7c8 ^ (uint)local_b00._24_4_);
      auVar242._0_4_ = local_7e0 ^ (uint)local_9c0._0_4_;
      auVar242._4_4_ = uStack_7dc ^ (uint)local_9c0._4_4_;
      auVar242._8_4_ = uStack_7d8 ^ (uint)local_9c0._8_4_;
      auVar242._12_4_ = uStack_7d4 ^ (uint)local_9c0._12_4_;
      auVar242._16_4_ = (uint)fStack_7d0 ^ (uint)local_9c0._16_4_;
      auVar242._20_4_ = (uint)fStack_7cc ^ (uint)local_9c0._20_4_;
      auVar242._24_4_ = (uint)fStack_7c8 ^ (uint)local_9c0._24_4_;
      auVar242._28_4_ = uStack_7c4 ^ local_9c0._28_4_;
      auVar172 = vsubps_avx(ZEXT832(0) << 0x20,local_820);
      auVar115 = vsubps_avx(ZEXT832(0) << 0x20,local_b80);
      auVar44._4_4_ = auVar115._4_4_ * fVar218;
      auVar44._0_4_ = auVar115._0_4_ * fVar219;
      auVar44._8_4_ = auVar115._8_4_ * fVar221;
      auVar44._12_4_ = auVar115._12_4_ * fVar224;
      auVar44._16_4_ = auVar115._16_4_ * fVar96;
      auVar44._20_4_ = auVar115._20_4_ * fVar131;
      auVar44._24_4_ = auVar115._24_4_ * fVar132;
      auVar44._28_4_ = auVar115._28_4_;
      auVar11 = vfmadd231ps_fma(auVar44,auVar242,auVar172);
      local_b20._28_4_ = auVar18._28_4_;
      auVar249._0_4_ = local_7e0 ^ (uint)auVar18._0_4_;
      auVar249._4_4_ = uStack_7dc ^ (uint)auVar18._4_4_;
      auVar249._8_4_ = uStack_7d8 ^ (uint)auVar18._8_4_;
      auVar249._12_4_ = uStack_7d4 ^ (uint)auVar18._12_4_;
      auVar249._16_4_ = (uint)fStack_7d0 ^ (uint)auVar18._16_4_;
      auVar249._20_4_ = (uint)fStack_7cc ^ (uint)auVar18._20_4_;
      auVar249._24_4_ = (uint)fStack_7c8 ^ (uint)auVar18._24_4_;
      auVar249._28_4_ = uStack_7c4 ^ local_b20._28_4_;
      auVar172 = vsubps_avx(ZEXT832(0) << 0x20,local_b60);
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar249,auVar172);
      auVar45._4_4_ = fVar218 * (float)local_ac0._4_4_;
      auVar45._0_4_ = fVar219 * (float)local_ac0._0_4_;
      auVar45._8_4_ = fVar221 * fStack_ab8;
      auVar45._12_4_ = fVar224 * fStack_ab4;
      auVar45._16_4_ = fVar96 * fStack_ab0;
      auVar45._20_4_ = fVar131 * fStack_aac;
      auVar45._24_4_ = fVar132 * fStack_aa8;
      auVar45._28_4_ = uStack_7c4 ^ local_b00._28_4_;
      auVar11 = vfmadd231ps_fma(auVar45,_local_880,auVar242);
      auVar138 = vfmadd231ps_fma(ZEXT1632(auVar11),_local_8a0,auVar249);
      auVar172 = vandps_avx(auVar61,ZEXT1632(auVar138));
      auVar295._8_4_ = 0x3f800000;
      auVar295._0_8_ = 0x3f8000003f800000;
      auVar295._12_4_ = 0x3f800000;
      auVar295._16_4_ = 0x3f800000;
      auVar295._20_4_ = 0x3f800000;
      auVar295._24_4_ = 0x3f800000;
      auVar295._28_4_ = 0x3f800000;
      auVar116 = vrcpps_avx(ZEXT1632(auVar138));
      auVar197._8_4_ = 0x219392ef;
      auVar197._0_8_ = 0x219392ef219392ef;
      auVar197._12_4_ = 0x219392ef;
      auVar197._16_4_ = 0x219392ef;
      auVar197._20_4_ = 0x219392ef;
      auVar197._24_4_ = 0x219392ef;
      auVar197._28_4_ = 0x219392ef;
      auVar115 = vcmpps_avx(auVar172,auVar197,1);
      auVar244 = ZEXT3264(auVar115);
      auVar214 = ZEXT1632(auVar138);
      auVar11 = vfnmadd213ps_fma(auVar116,auVar214,auVar295);
      auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar116,auVar116);
      auVar250._0_4_ = auVar138._0_4_ ^ local_7e0;
      auVar250._4_4_ = auVar138._4_4_ ^ uStack_7dc;
      auVar250._8_4_ = auVar138._8_4_ ^ uStack_7d8;
      auVar250._12_4_ = auVar138._12_4_ ^ uStack_7d4;
      auVar250._16_4_ = fStack_7d0;
      auVar250._20_4_ = fStack_7cc;
      auVar250._24_4_ = fStack_7c8;
      auVar250._28_4_ = uStack_7c4;
      auVar46._4_4_ = auVar11._4_4_ * (float)(auVar105._4_4_ ^ uStack_7dc);
      auVar46._0_4_ = auVar11._0_4_ * (float)(auVar105._0_4_ ^ local_7e0);
      auVar46._8_4_ = auVar11._8_4_ * (float)(auVar105._8_4_ ^ uStack_7d8);
      auVar46._12_4_ = auVar11._12_4_ * (float)(auVar105._12_4_ ^ uStack_7d4);
      auVar46._16_4_ = fStack_7d0 * 0.0;
      auVar46._20_4_ = fStack_7cc * 0.0;
      auVar46._24_4_ = fStack_7c8 * 0.0;
      auVar46._28_4_ = uStack_7c4;
      auVar271 = ZEXT3264(auVar46);
      auVar172 = vcmpps_avx(auVar214,auVar250,1);
      auVar172 = vorps_avx(auVar172,auVar115);
      auVar147._8_4_ = 0xff800000;
      auVar147._0_8_ = 0xff800000ff800000;
      auVar147._12_4_ = 0xff800000;
      auVar147._16_4_ = 0xff800000;
      auVar147._20_4_ = 0xff800000;
      auVar147._24_4_ = 0xff800000;
      auVar147._28_4_ = 0xff800000;
      auVar172 = vblendvps_avx(auVar46,auVar147,auVar172);
      auVar282 = ZEXT3264(auVar172);
      _local_a60 = vmaxps_avx(auVar17,auVar172);
      auVar172 = vcmpps_avx(auVar214,auVar250,6);
      auVar172 = vorps_avx(auVar115,auVar172);
      auVar198._8_4_ = 0x7f800000;
      auVar198._0_8_ = 0x7f8000007f800000;
      auVar198._12_4_ = 0x7f800000;
      auVar198._16_4_ = 0x7f800000;
      auVar198._20_4_ = 0x7f800000;
      auVar198._24_4_ = 0x7f800000;
      auVar198._28_4_ = 0x7f800000;
      auVar172 = vblendvps_avx(auVar46,auVar198,auVar172);
      auVar110 = vandps_avx(local_7c0,auVar110);
      local_340 = vminps_avx(auVar148,auVar172);
      auVar172 = vcmpps_avx(_local_a60,local_340,2);
      auVar115 = auVar110 & auVar172;
      if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar115 >> 0x7f,0) != '\0') ||
            (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar115 >> 0xbf,0) != '\0') ||
          (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar115[0x1f] < '\0') {
        auVar77._4_4_ = fStack_2dc;
        auVar77._0_4_ = local_2e0;
        auVar77._8_4_ = fStack_2d8;
        auVar77._12_4_ = fStack_2d4;
        auVar77._16_4_ = uStack_2d0;
        auVar77._20_4_ = uStack_2cc;
        auVar77._24_4_ = uStack_2c8;
        auVar77._28_4_ = uStack_2c4;
        auVar115 = vminps_avx(auVar77,auVar295);
        auVar282 = ZEXT864(0) << 0x20;
        auVar115 = vmaxps_avx(auVar115,ZEXT832(0) << 0x20);
        auVar76._4_4_ = fStack_2fc;
        auVar76._0_4_ = local_300;
        auVar76._8_4_ = fStack_2f8;
        auVar76._12_4_ = fStack_2f4;
        auVar76._16_4_ = uStack_2f0;
        auVar76._20_4_ = uStack_2ec;
        auVar76._24_4_ = uStack_2e8;
        auVar76._28_4_ = uStack_2e4;
        auVar17 = vminps_avx(auVar76,auVar295);
        auVar17 = vmaxps_avx(auVar17,ZEXT832(0) << 0x20);
        auVar47._4_4_ = (auVar115._4_4_ + 1.0) * 0.125;
        auVar47._0_4_ = (auVar115._0_4_ + 0.0) * 0.125;
        auVar47._8_4_ = (auVar115._8_4_ + 2.0) * 0.125;
        auVar47._12_4_ = (auVar115._12_4_ + 3.0) * 0.125;
        auVar47._16_4_ = (auVar115._16_4_ + 4.0) * 0.125;
        auVar47._20_4_ = (auVar115._20_4_ + 5.0) * 0.125;
        auVar47._24_4_ = (auVar115._24_4_ + 6.0) * 0.125;
        auVar47._28_4_ = auVar115._28_4_ + 7.0;
        auVar11 = vfmadd213ps_fma(auVar47,local_860,local_840);
        auVar48._4_4_ = (auVar17._4_4_ + 1.0) * 0.125;
        auVar48._0_4_ = (auVar17._0_4_ + 0.0) * 0.125;
        auVar48._8_4_ = (auVar17._8_4_ + 2.0) * 0.125;
        auVar48._12_4_ = (auVar17._12_4_ + 3.0) * 0.125;
        auVar48._16_4_ = (auVar17._16_4_ + 4.0) * 0.125;
        auVar48._20_4_ = (auVar17._20_4_ + 5.0) * 0.125;
        auVar48._24_4_ = (auVar17._24_4_ + 6.0) * 0.125;
        auVar48._28_4_ = auVar17._28_4_ + 7.0;
        auVar105 = vfmadd213ps_fma(auVar48,local_860,local_840);
        auVar148 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar115 = vminps_avx(auVar294,auVar234);
        auVar17 = vminps_avx(auVar19,auVar20);
        auVar115 = vminps_avx(auVar115,auVar17);
        auVar111 = vsubps_avx(auVar115,auVar111);
        auVar110 = vandps_avx(auVar172,auVar110);
        local_1a0 = ZEXT1632(auVar11);
        local_1c0 = ZEXT1632(auVar105);
        auVar49._4_4_ = auVar111._4_4_ * 0.99999976;
        auVar49._0_4_ = auVar111._0_4_ * 0.99999976;
        auVar49._8_4_ = auVar111._8_4_ * 0.99999976;
        auVar49._12_4_ = auVar111._12_4_ * 0.99999976;
        auVar49._16_4_ = auVar111._16_4_ * 0.99999976;
        auVar49._20_4_ = auVar111._20_4_ * 0.99999976;
        auVar49._24_4_ = auVar111._24_4_ * 0.99999976;
        auVar49._28_4_ = auVar111._28_4_;
        auVar172 = vmaxps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar49);
        auVar50._4_4_ = auVar172._4_4_ * auVar172._4_4_;
        auVar50._0_4_ = auVar172._0_4_ * auVar172._0_4_;
        auVar50._8_4_ = auVar172._8_4_ * auVar172._8_4_;
        auVar50._12_4_ = auVar172._12_4_ * auVar172._12_4_;
        auVar50._16_4_ = auVar172._16_4_ * auVar172._16_4_;
        auVar50._20_4_ = auVar172._20_4_ * auVar172._20_4_;
        auVar50._24_4_ = auVar172._24_4_ * auVar172._24_4_;
        auVar50._28_4_ = auVar172._28_4_;
        auVar111 = vsubps_avx(auVar13,auVar50);
        auVar51._4_4_ = fVar220 * 4.0 * auVar111._4_4_;
        auVar51._0_4_ = fVar217 * 4.0 * auVar111._0_4_;
        auVar51._8_4_ = fVar223 * 4.0 * auVar111._8_4_;
        auVar51._12_4_ = fVar178 * 4.0 * auVar111._12_4_;
        auVar51._16_4_ = fVar257 * 4.0 * auVar111._16_4_;
        auVar51._20_4_ = fVar261 * 4.0 * auVar111._20_4_;
        auVar51._24_4_ = fVar262 * 4.0 * auVar111._24_4_;
        auVar51._28_4_ = auVar172._28_4_;
        auVar13 = vsubps_avx(auVar37,auVar51);
        auVar271 = ZEXT3264(auVar13);
        auVar172 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,5);
        if ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar172 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar172 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar172 >> 0x7f,0) == '\0') &&
              (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar172 >> 0xbf,0) == '\0') &&
            (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar172[0x1f]) {
          auVar120 = SUB6432(ZEXT864(0),0) << 0x20;
          local_940 = ZEXT832(0) << 0x20;
          _local_800 = ZEXT832(0) << 0x20;
          auVar174 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar243._8_4_ = 0x7f800000;
          auVar243._0_8_ = 0x7f8000007f800000;
          auVar243._12_4_ = 0x7f800000;
          auVar243._16_4_ = 0x7f800000;
          auVar243._20_4_ = 0x7f800000;
          auVar243._24_4_ = 0x7f800000;
          auVar243._28_4_ = 0x7f800000;
          auVar251._8_4_ = 0xff800000;
          auVar251._0_8_ = 0xff800000ff800000;
          auVar251._12_4_ = 0xff800000;
          auVar251._16_4_ = 0xff800000;
          auVar251._20_4_ = 0xff800000;
          auVar251._24_4_ = 0xff800000;
          auVar251._28_4_ = 0xff800000;
          local_920 = local_940;
        }
        else {
          auVar17 = vsqrtps_avx(auVar13);
          auVar252._0_4_ = fVar217 + fVar217;
          auVar252._4_4_ = fVar220 + fVar220;
          auVar252._8_4_ = fVar223 + fVar223;
          auVar252._12_4_ = fVar178 + fVar178;
          auVar252._16_4_ = fVar257 + fVar257;
          auVar252._20_4_ = fVar261 + fVar261;
          auVar252._24_4_ = fVar262 + fVar262;
          auVar252._28_4_ = fVar201 + fVar201;
          auVar115 = vrcpps_avx(auVar252);
          auVar11 = vfnmadd213ps_fma(auVar252,auVar115,auVar295);
          auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar115,auVar115);
          auVar280._0_4_ = local_a20._0_4_ ^ local_7e0;
          auVar280._4_4_ = (uint)local_a20._4_4_ ^ uStack_7dc;
          auVar280._8_4_ = (uint)local_a20._8_4_ ^ uStack_7d8;
          auVar280._12_4_ = (uint)local_a20._12_4_ ^ uStack_7d4;
          auVar280._16_4_ = (uint)local_a20._16_4_ ^ (uint)fStack_7d0;
          auVar280._20_4_ = (uint)local_a20._20_4_ ^ (uint)fStack_7cc;
          auVar280._24_4_ = (uint)local_a20._24_4_ ^ (uint)fStack_7c8;
          auVar280._28_4_ = (uint)local_a20._28_4_ ^ uStack_7c4;
          auVar115 = vsubps_avx(auVar280,auVar17);
          auVar148 = vsubps_avx(auVar17,local_a20);
          fVar219 = auVar115._0_4_ * auVar11._0_4_;
          fVar218 = auVar115._4_4_ * auVar11._4_4_;
          auVar52._4_4_ = fVar218;
          auVar52._0_4_ = fVar219;
          fVar217 = auVar115._8_4_ * auVar11._8_4_;
          auVar52._8_4_ = fVar217;
          fVar221 = auVar115._12_4_ * auVar11._12_4_;
          auVar52._12_4_ = fVar221;
          fVar220 = auVar115._16_4_ * 0.0;
          auVar52._16_4_ = fVar220;
          fVar224 = auVar115._20_4_ * 0.0;
          auVar52._20_4_ = fVar224;
          fVar223 = auVar115._24_4_ * 0.0;
          auVar52._24_4_ = fVar223;
          auVar52._28_4_ = auVar17._28_4_;
          fVar96 = auVar11._0_4_ * auVar148._0_4_;
          fVar131 = auVar11._4_4_ * auVar148._4_4_;
          auVar53._4_4_ = fVar131;
          auVar53._0_4_ = fVar96;
          fVar132 = auVar11._8_4_ * auVar148._8_4_;
          auVar53._8_4_ = fVar132;
          fVar133 = auVar11._12_4_ * auVar148._12_4_;
          auVar53._12_4_ = fVar133;
          fVar134 = auVar148._16_4_ * 0.0;
          auVar53._16_4_ = fVar134;
          fVar135 = auVar148._20_4_ * 0.0;
          auVar53._20_4_ = fVar135;
          fVar136 = auVar148._24_4_ * 0.0;
          auVar53._24_4_ = fVar136;
          auVar53._28_4_ = auVar115._28_4_;
          auVar282 = ZEXT3264(auVar53);
          auVar11 = vfmadd213ps_fma(auVar276,auVar52,auVar296);
          auVar105 = vfmadd213ps_fma(auVar276,auVar53,auVar296);
          auVar115 = ZEXT1632(CONCAT412(auVar11._12_4_ * fVar273,
                                        CONCAT48(auVar11._8_4_ * fVar256,
                                                 CONCAT44(auVar11._4_4_ * fVar222,
                                                          auVar11._0_4_ * fVar216))));
          auVar54._28_4_ = local_880._28_4_;
          auVar54._0_28_ =
               ZEXT1628(CONCAT412(auVar105._12_4_ * fVar273,
                                  CONCAT48(auVar105._8_4_ * fVar256,
                                           CONCAT44(auVar105._4_4_ * fVar222,
                                                    auVar105._0_4_ * fVar216))));
          auVar11 = vfmadd213ps_fma(auVar15,auVar115,auVar113);
          auVar105 = vfmadd213ps_fma(auVar15,auVar54,auVar113);
          auVar138 = vfmadd213ps_fma(auVar16,auVar115,local_a00);
          auVar98 = vfmadd213ps_fma(auVar16,auVar54,local_a00);
          auVar139 = vfmadd213ps_fma(auVar115,auVar120,auVar166);
          auVar179 = vfmadd213ps_fma(auVar120,auVar54,auVar166);
          auVar55._4_4_ = (float)local_8a0._4_4_ * fVar218;
          auVar55._0_4_ = (float)local_8a0._0_4_ * fVar219;
          auVar55._8_4_ = fStack_898 * fVar217;
          auVar55._12_4_ = fStack_894 * fVar221;
          auVar55._16_4_ = fStack_890 * fVar220;
          auVar55._20_4_ = fStack_88c * fVar224;
          auVar55._24_4_ = fStack_888 * fVar223;
          auVar55._28_4_ = 0;
          auVar120 = vsubps_avx(auVar55,ZEXT1632(auVar11));
          auVar56._4_4_ = (float)local_880._4_4_ * fVar218;
          auVar56._0_4_ = (float)local_880._0_4_ * fVar219;
          auVar56._8_4_ = fStack_878 * fVar217;
          auVar56._12_4_ = fStack_874 * fVar221;
          auVar56._16_4_ = fStack_870 * fVar220;
          auVar56._20_4_ = fStack_86c * fVar224;
          auVar56._24_4_ = fStack_868 * fVar223;
          auVar56._28_4_ = fVar201;
          auVar148 = vsubps_avx(auVar56,ZEXT1632(auVar138));
          auVar167._0_4_ = (float)local_ac0._0_4_ * fVar219;
          auVar167._4_4_ = (float)local_ac0._4_4_ * fVar218;
          auVar167._8_4_ = fStack_ab8 * fVar217;
          auVar167._12_4_ = fStack_ab4 * fVar221;
          auVar167._16_4_ = fStack_ab0 * fVar220;
          auVar167._20_4_ = fStack_aac * fVar224;
          auVar167._24_4_ = fStack_aa8 * fVar223;
          auVar167._28_4_ = 0;
          auVar15 = vsubps_avx(auVar167,ZEXT1632(auVar139));
          auVar174 = ZEXT3264(auVar15);
          auVar253._0_4_ = (float)local_8a0._0_4_ * fVar96;
          auVar253._4_4_ = (float)local_8a0._4_4_ * fVar131;
          auVar253._8_4_ = fStack_898 * fVar132;
          auVar253._12_4_ = fStack_894 * fVar133;
          auVar253._16_4_ = fStack_890 * fVar134;
          auVar253._20_4_ = fStack_88c * fVar135;
          auVar253._24_4_ = fStack_888 * fVar136;
          auVar253._28_4_ = 0;
          local_920 = vsubps_avx(auVar253,ZEXT1632(auVar105));
          auVar57._4_4_ = (float)local_880._4_4_ * fVar131;
          auVar57._0_4_ = (float)local_880._0_4_ * fVar96;
          auVar57._8_4_ = fStack_878 * fVar132;
          auVar57._12_4_ = fStack_874 * fVar133;
          auVar57._16_4_ = fStack_870 * fVar134;
          auVar57._20_4_ = fStack_86c * fVar135;
          auVar57._24_4_ = fStack_868 * fVar136;
          auVar57._28_4_ = local_920._28_4_;
          local_940 = vsubps_avx(auVar57,ZEXT1632(auVar98));
          auVar58._4_4_ = (float)local_ac0._4_4_ * fVar131;
          auVar58._0_4_ = (float)local_ac0._0_4_ * fVar96;
          auVar58._8_4_ = fStack_ab8 * fVar132;
          auVar58._12_4_ = fStack_ab4 * fVar133;
          auVar58._16_4_ = fStack_ab0 * fVar134;
          auVar58._20_4_ = fStack_aac * fVar135;
          auVar58._24_4_ = fStack_aa8 * fVar136;
          auVar58._28_4_ = local_940._28_4_;
          _local_800 = vsubps_avx(auVar58,ZEXT1632(auVar179));
          auVar277 = ZEXT864(0) << 0x20;
          auVar15 = vcmpps_avx(auVar13,_DAT_01faff00,5);
          auVar254._8_4_ = 0x7f800000;
          auVar254._0_8_ = 0x7f8000007f800000;
          auVar254._12_4_ = 0x7f800000;
          auVar254._16_4_ = 0x7f800000;
          auVar254._20_4_ = 0x7f800000;
          auVar254._24_4_ = 0x7f800000;
          auVar254._28_4_ = 0x7f800000;
          auVar243 = vblendvps_avx(auVar254,auVar52,auVar15);
          auVar62._4_4_ = uStack_8fc;
          auVar62._0_4_ = local_900;
          auVar62._8_4_ = uStack_8f8;
          auVar62._12_4_ = uStack_8f4;
          auVar62._16_4_ = uStack_8f0;
          auVar62._20_4_ = uStack_8ec;
          auVar62._24_4_ = uStack_8e8;
          auVar62._28_4_ = uStack_8e4;
          auVar13 = vandps_avx(auVar62,auVar36);
          auVar13 = vmaxps_avx(local_620,auVar13);
          auVar59._4_4_ = auVar13._4_4_ * 1.9073486e-06;
          auVar59._0_4_ = auVar13._0_4_ * 1.9073486e-06;
          auVar59._8_4_ = auVar13._8_4_ * 1.9073486e-06;
          auVar59._12_4_ = auVar13._12_4_ * 1.9073486e-06;
          auVar59._16_4_ = auVar13._16_4_ * 1.9073486e-06;
          auVar59._20_4_ = auVar13._20_4_ * 1.9073486e-06;
          auVar59._24_4_ = auVar13._24_4_ * 1.9073486e-06;
          auVar59._28_4_ = auVar13._28_4_;
          auVar13 = vandps_avx(auVar62,local_8e0);
          auVar13 = vcmpps_avx(auVar13,auVar59,1);
          auVar271 = ZEXT3264(auVar13);
          auVar255._8_4_ = 0xff800000;
          auVar255._0_8_ = 0xff800000ff800000;
          auVar255._12_4_ = 0xff800000;
          auVar255._16_4_ = 0xff800000;
          auVar255._20_4_ = 0xff800000;
          auVar255._24_4_ = 0xff800000;
          auVar255._28_4_ = 0xff800000;
          auVar251 = vblendvps_avx(auVar255,auVar53,auVar15);
          auVar16 = auVar15 & auVar13;
          if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar16 >> 0x7f,0) != '\0') ||
                (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar16 >> 0xbf,0) != '\0') ||
              (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar16[0x1f] < '\0') {
            auVar172 = vandps_avx(auVar13,auVar15);
            auVar13 = vcmpps_avx(auVar111,ZEXT832(0) << 0x20,2);
            auVar281._8_4_ = 0xff800000;
            auVar281._0_8_ = 0xff800000ff800000;
            auVar281._12_4_ = 0xff800000;
            auVar281._16_4_ = 0xff800000;
            auVar281._20_4_ = 0xff800000;
            auVar281._24_4_ = 0xff800000;
            auVar281._28_4_ = 0xff800000;
            auVar282 = ZEXT3264(auVar281);
            auVar291._8_4_ = 0x7f800000;
            auVar291._0_8_ = 0x7f8000007f800000;
            auVar291._12_4_ = 0x7f800000;
            auVar291._16_4_ = 0x7f800000;
            auVar291._20_4_ = 0x7f800000;
            auVar291._24_4_ = 0x7f800000;
            auVar291._28_4_ = 0x7f800000;
            auVar111 = vblendvps_avx(auVar291,auVar281,auVar13);
            auVar11 = vpackssdw_avx(auVar172._0_16_,auVar172._16_16_);
            auVar16 = vpmovsxwd_avx2(auVar11);
            auVar271 = ZEXT3264(auVar16);
            auVar243 = vblendvps_avx(auVar243,auVar111,auVar16);
            auVar111 = vblendvps_avx(auVar281,auVar291,auVar13);
            auVar277 = ZEXT3264(auVar111);
            auVar251 = vblendvps_avx(auVar251,auVar111,auVar16);
            auVar235._0_8_ = auVar172._0_8_ ^ 0xffffffffffffffff;
            auVar235._8_4_ = auVar172._8_4_ ^ 0xffffffff;
            auVar235._12_4_ = auVar172._12_4_ ^ 0xffffffff;
            auVar235._16_4_ = auVar172._16_4_ ^ 0xffffffff;
            auVar235._20_4_ = auVar172._20_4_ ^ 0xffffffff;
            auVar235._24_4_ = auVar172._24_4_ ^ 0xffffffff;
            auVar235._28_4_ = auVar172._28_4_ ^ 0xffffffff;
            auVar172 = vorps_avx(auVar13,auVar235);
            auVar172 = vandps_avx(auVar15,auVar172);
          }
        }
        auVar260 = ZEXT3264(_local_a60);
        local_4c0 = _local_a60;
        local_4a0 = vminps_avx(local_340,auVar243);
        local_b20 = vmaxps_avx(_local_a60,auVar251);
        local_360 = local_b20;
        auVar111 = vcmpps_avx(_local_a60,local_4a0,2);
        local_720 = vandps_avx(auVar111,auVar110);
        auVar111 = vcmpps_avx(local_b20,local_340,2);
        local_7a0 = vandps_avx(auVar111,auVar110);
        auVar244 = ZEXT3264(local_7a0);
        auVar110 = vorps_avx(local_7a0,local_720);
        if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar110 >> 0x7f,0) != '\0') ||
              (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar110 >> 0xbf,0) != '\0') ||
            (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar110[0x1f] < '\0') {
          local_760._0_8_ = auVar172._0_8_ ^ 0xffffffffffffffff;
          local_760._8_4_ = auVar172._8_4_ ^ 0xffffffff;
          local_760._12_4_ = auVar172._12_4_ ^ 0xffffffff;
          local_760._16_4_ = auVar172._16_4_ ^ 0xffffffff;
          local_760._20_4_ = auVar172._20_4_ ^ 0xffffffff;
          local_760._24_4_ = auVar172._24_4_ ^ 0xffffffff;
          local_760._28_4_ = auVar172._28_4_ ^ 0xffffffff;
          auVar175._0_4_ = (float)local_ac0._0_4_ * auVar174._0_4_;
          auVar175._4_4_ = (float)local_ac0._4_4_ * auVar174._4_4_;
          auVar175._8_4_ = fStack_ab8 * auVar174._8_4_;
          auVar175._12_4_ = fStack_ab4 * auVar174._12_4_;
          auVar175._16_4_ = fStack_ab0 * auVar174._16_4_;
          auVar175._20_4_ = fStack_aac * auVar174._20_4_;
          auVar175._28_36_ = auVar174._28_36_;
          auVar175._24_4_ = fStack_aa8 * auVar174._24_4_;
          auVar11 = vfmadd213ps_fma(auVar148,_local_880,auVar175._0_32_);
          auVar11 = vfmadd213ps_fma(auVar120,_local_8a0,ZEXT1632(auVar11));
          auVar63._4_4_ = uStack_8fc;
          auVar63._0_4_ = local_900;
          auVar63._8_4_ = uStack_8f8;
          auVar63._12_4_ = uStack_8f4;
          auVar63._16_4_ = uStack_8f0;
          auVar63._20_4_ = uStack_8ec;
          auVar63._24_4_ = uStack_8e8;
          auVar63._28_4_ = uStack_8e4;
          auVar110 = vandps_avx(ZEXT1632(auVar11),auVar63);
          auVar149._8_4_ = 0x3e99999a;
          auVar149._0_8_ = 0x3e99999a3e99999a;
          auVar149._12_4_ = 0x3e99999a;
          auVar149._16_4_ = 0x3e99999a;
          auVar149._20_4_ = 0x3e99999a;
          auVar149._24_4_ = 0x3e99999a;
          auVar149._28_4_ = 0x3e99999a;
          auVar110 = vcmpps_avx(auVar110,auVar149,1);
          auVar110 = vorps_avx(auVar110,local_760);
          auVar150._8_4_ = 3;
          auVar150._0_8_ = 0x300000003;
          auVar150._12_4_ = 3;
          auVar150._16_4_ = 3;
          auVar150._20_4_ = 3;
          auVar150._24_4_ = 3;
          auVar150._28_4_ = 3;
          auVar168._8_4_ = 2;
          auVar168._0_8_ = 0x200000002;
          auVar168._12_4_ = 2;
          auVar168._16_4_ = 2;
          auVar168._20_4_ = 2;
          auVar168._24_4_ = 2;
          auVar168._28_4_ = 2;
          auVar110 = vblendvps_avx(auVar168,auVar150,auVar110);
          local_780._4_4_ = local_ca4;
          local_780._0_4_ = local_ca4;
          local_780._8_4_ = local_ca4;
          local_780._12_4_ = local_ca4;
          local_780._16_4_ = local_ca4;
          local_780._20_4_ = local_ca4;
          local_780._24_4_ = local_ca4;
          local_780._28_4_ = local_ca4;
          local_740 = vpcmpgtd_avx2(auVar110,local_780);
          local_6e0 = vpandn_avx2(local_740,local_720);
          auVar174 = ZEXT3264(local_6e0);
          auVar110 = local_720 & ~local_740;
          fStack_bec = auVar10._4_4_;
          fStack_be8 = auVar10._8_4_;
          fStack_be4 = auVar10._12_4_;
          if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar110 >> 0x7f,0) == '\0') &&
                (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar110 >> 0xbf,0) == '\0') &&
              (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar110[0x1f]) {
            auVar121._4_4_ = fVar263;
            auVar121._0_4_ = fVar263;
            auVar121._8_4_ = fVar263;
            auVar121._12_4_ = fVar263;
            auVar121._16_4_ = fVar263;
            auVar121._20_4_ = fVar263;
            auVar121._24_4_ = fVar263;
            auVar121._28_4_ = fVar263;
            auVar110 = local_b20;
            fVar201 = (float)local_ac0._0_4_;
            fVar219 = (float)local_ac0._4_4_;
            fVar218 = fStack_ab8;
            fVar217 = fStack_ab4;
            fVar256 = fStack_ab0;
            fVar221 = fStack_aac;
            fVar220 = fStack_aa8;
            local_b20 = auVar18;
            local_7a0 = auVar36;
          }
          else {
            auVar105 = vminps_avx(auVar12,auVar100);
            auVar11 = vmaxps_avx(auVar12,auVar100);
            auVar138 = vminps_avx(auVar9,auVar10);
            auVar98 = vminps_avx(auVar105,auVar138);
            auVar105 = vmaxps_avx(auVar9,auVar10);
            auVar138 = vmaxps_avx(auVar11,auVar105);
            auVar11 = vandps_avx(auVar98,auVar238);
            auVar105 = vandps_avx(auVar138,auVar238);
            auVar11 = vmaxps_avx(auVar11,auVar105);
            auVar105 = vmovshdup_avx(auVar11);
            auVar105 = vmaxss_avx(auVar105,auVar11);
            auVar11 = vshufpd_avx(auVar11,auVar11,1);
            auVar11 = vmaxss_avx(auVar11,auVar105);
            local_a00 = ZEXT1632(CONCAT124(auVar99._4_12_,auVar11._0_4_ * 1.9073486e-06));
            auVar11 = vshufps_avx(auVar138,auVar138,0xff);
            local_a40 = ZEXT1632(auVar11);
            local_8c0._4_4_ = (float)local_a60._4_4_ + (float)local_9a0._4_4_;
            local_8c0._0_4_ = (float)local_a60._0_4_ + (float)local_9a0._0_4_;
            fStack_8b8 = fStack_a58 + fStack_998;
            fStack_8b4 = fStack_a54 + fStack_994;
            fStack_8b0 = fStack_a50 + fStack_990;
            fStack_8ac = fStack_a4c + fStack_98c;
            fStack_8a8 = fStack_a48 + fStack_988;
            fStack_8a4 = fStack_a44 + fStack_984;
            do {
              auVar122._8_4_ = 0x7f800000;
              auVar122._0_8_ = 0x7f8000007f800000;
              auVar122._12_4_ = 0x7f800000;
              auVar122._16_4_ = 0x7f800000;
              auVar122._20_4_ = 0x7f800000;
              auVar122._24_4_ = 0x7f800000;
              auVar122._28_4_ = 0x7f800000;
              auVar110 = auVar174._0_32_;
              auVar172 = vblendvps_avx(auVar122,_local_a60,auVar110);
              auVar111 = vshufps_avx(auVar172,auVar172,0xb1);
              auVar111 = vminps_avx(auVar172,auVar111);
              auVar13 = vshufpd_avx(auVar111,auVar111,5);
              auVar111 = vminps_avx(auVar111,auVar13);
              auVar13 = vpermpd_avx2(auVar111,0x4e);
              auVar111 = vminps_avx(auVar111,auVar13);
              auVar172 = vcmpps_avx(auVar172,auVar111,0);
              auVar111 = auVar110 & auVar172;
              if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar111 >> 0x7f,0) != '\0') ||
                    (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar111 >> 0xbf,0) != '\0') ||
                  (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar111[0x1f] < '\0') {
                auVar110 = vandps_avx(auVar172,auVar110);
              }
              uVar88 = vmovmskps_avx(auVar110);
              iVar21 = 0;
              for (; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000) {
                iVar21 = iVar21 + 1;
              }
              uVar89 = iVar21 << 2;
              *(undefined4 *)(local_6e0 + uVar89) = 0;
              uVar88 = *(uint *)(local_1a0 + uVar89);
              uVar89 = *(uint *)(local_4c0 + uVar89);
              fVar201 = auVar7._0_4_;
              if ((float)local_a80._0_4_ < 0.0) {
                fVar201 = sqrtf((float)local_a80._0_4_);
              }
              local_ae0._0_4_ = fVar201 * 1.9073486e-06;
              auVar11 = vinsertps_avx(ZEXT416(uVar89),ZEXT416(uVar88),0x10);
              auVar260 = ZEXT1664(auVar11);
              lVar90 = 5;
              do {
                auVar98 = auVar260._0_16_;
                local_b60._0_16_ = vmovshdup_avx(auVar98);
                fVar216 = local_b60._0_4_;
                fVar217 = 1.0 - fVar216;
                fVar222 = fVar217 * fVar217 * fVar217;
                fVar218 = fVar216 * fVar216;
                fVar219 = fVar216 * fVar218;
                auVar99 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar222),
                                          ZEXT416((uint)fVar219));
                fVar201 = fVar216 * fVar217;
                auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * fVar201 * 6.0)),
                                           ZEXT416((uint)(fVar217 * fVar201)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar138 = vfmadd231ss_fma(ZEXT416((uint)(fVar217 * fVar201 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar216 * fVar201)));
                auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar219),
                                          ZEXT416((uint)fVar222));
                fVar216 = (auVar11._0_4_ + auVar138._0_4_) * 0.16666667;
                fVar219 = fVar219 * 0.16666667;
                auVar140._0_4_ = fVar219 * fVar130;
                auVar140._4_4_ = fVar219 * fStack_bec;
                auVar140._8_4_ = fVar219 * fStack_be8;
                auVar140._12_4_ = fVar219 * fStack_be4;
                auVar180._4_4_ = fVar216;
                auVar180._0_4_ = fVar216;
                auVar180._8_4_ = fVar216;
                auVar180._12_4_ = fVar216;
                auVar11 = vfmadd132ps_fma(auVar180,auVar140,auVar9);
                fVar216 = (auVar99._0_4_ + auVar105._0_4_) * 0.16666667;
                auVar141._4_4_ = fVar216;
                auVar141._0_4_ = fVar216;
                auVar141._8_4_ = fVar216;
                auVar141._12_4_ = fVar216;
                auVar11 = vfmadd132ps_fma(auVar141,auVar11,auVar100);
                fVar219 = auVar260._0_4_;
                auVar156._4_4_ = fVar219;
                auVar156._0_4_ = fVar219;
                auVar156._8_4_ = fVar219;
                auVar156._12_4_ = fVar219;
                auVar99 = vfmadd213ps_fma(auVar156,local_a70,_DAT_01f7aa10);
                fVar222 = fVar222 * 0.16666667;
                auVar101._4_4_ = fVar222;
                auVar101._0_4_ = fVar222;
                auVar101._8_4_ = fVar222;
                auVar101._12_4_ = fVar222;
                auVar11 = vfmadd132ps_fma(auVar101,auVar11,auVar12);
                local_820._0_16_ = auVar11;
                auVar99 = vsubps_avx(auVar99,auVar11);
                auVar11 = vdpps_avx(auVar99,auVar99,0x7f);
                fVar216 = auVar11._0_4_;
                if (fVar216 < 0.0) {
                  local_b80._0_16_ = ZEXT416((uint)fVar217);
                  local_aa0._0_4_ = fVar218;
                  auVar244._0_4_ = sqrtf(fVar216);
                  auVar244._4_60_ = extraout_var;
                  auVar105 = auVar244._0_16_;
                  fVar218 = (float)local_aa0._0_4_;
                  auVar138 = local_b80._0_16_;
                }
                else {
                  auVar105 = vsqrtss_avx(auVar11,auVar11);
                  auVar138 = ZEXT416((uint)fVar217);
                }
                fVar222 = auVar138._0_4_;
                auVar102._4_4_ = fVar222;
                auVar102._0_4_ = fVar222;
                auVar102._8_4_ = fVar222;
                auVar102._12_4_ = fVar222;
                auVar179 = vfnmsub213ss_fma(local_b60._0_16_,local_b60._0_16_,
                                            ZEXT416((uint)(fVar201 * 4.0)));
                auVar139 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * 4.0)),auVar138,auVar138);
                fVar201 = fVar222 * -fVar222 * 0.5;
                fVar222 = auVar179._0_4_ * 0.5;
                fVar217 = auVar139._0_4_ * 0.5;
                fVar218 = fVar218 * 0.5;
                auVar229._0_4_ = fVar130 * fVar218;
                auVar229._4_4_ = fStack_bec * fVar218;
                auVar229._8_4_ = fStack_be8 * fVar218;
                auVar229._12_4_ = fStack_be4 * fVar218;
                auVar181._4_4_ = fVar217;
                auVar181._0_4_ = fVar217;
                auVar181._8_4_ = fVar217;
                auVar181._12_4_ = fVar217;
                auVar139 = vfmadd213ps_fma(auVar181,auVar9,auVar229);
                auVar204._4_4_ = fVar222;
                auVar204._0_4_ = fVar222;
                auVar204._8_4_ = fVar222;
                auVar204._12_4_ = fVar222;
                auVar139 = vfmadd213ps_fma(auVar204,auVar100,auVar139);
                auVar269._4_4_ = fVar201;
                auVar269._0_4_ = fVar201;
                auVar269._8_4_ = fVar201;
                auVar269._12_4_ = fVar201;
                auVar203 = vfmadd213ps_fma(auVar269,auVar12,auVar139);
                auVar139 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar138,local_b60._0_16_)
                ;
                auVar179 = vfmadd213ss_fma(local_b60._0_16_,SUB6416(ZEXT464(0xc0000000),0),auVar138)
                ;
                auVar138 = vshufps_avx(auVar98,auVar98,0x55);
                auVar182._0_4_ = fVar130 * auVar138._0_4_;
                auVar182._4_4_ = fStack_bec * auVar138._4_4_;
                auVar182._8_4_ = fStack_be8 * auVar138._8_4_;
                auVar182._12_4_ = fStack_be4 * auVar138._12_4_;
                uVar95 = auVar179._0_4_;
                auVar205._4_4_ = uVar95;
                auVar205._0_4_ = uVar95;
                auVar205._8_4_ = uVar95;
                auVar205._12_4_ = uVar95;
                auVar138 = vfmadd213ps_fma(auVar205,auVar9,auVar182);
                auVar157._0_4_ = auVar139._0_4_;
                auVar157._4_4_ = auVar157._0_4_;
                auVar157._8_4_ = auVar157._0_4_;
                auVar157._12_4_ = auVar157._0_4_;
                auVar138 = vfmadd213ps_fma(auVar157,auVar100,auVar138);
                auVar97 = vfmadd231ps_fma(auVar138,auVar12,auVar102);
                auVar139 = vdpps_avx(auVar203,auVar203,0x7f);
                auVar138 = vblendps_avx(auVar139,_DAT_01f7aa10,0xe);
                auVar179 = vrsqrtss_avx(auVar138,auVar138);
                fVar201 = auVar179._0_4_;
                fVar218 = auVar139._0_4_;
                fVar201 = fVar201 * 1.5 + fVar218 * -0.5 * fVar201 * fVar201 * fVar201;
                auVar179 = vdpps_avx(auVar203,auVar97,0x7f);
                auVar158._0_4_ = auVar97._0_4_ * fVar218;
                auVar158._4_4_ = auVar97._4_4_ * fVar218;
                auVar158._8_4_ = auVar97._8_4_ * fVar218;
                auVar158._12_4_ = auVar97._12_4_ * fVar218;
                fVar222 = auVar179._0_4_;
                auVar230._0_4_ = auVar203._0_4_ * fVar222;
                auVar230._4_4_ = auVar203._4_4_ * fVar222;
                fVar217 = auVar203._8_4_;
                auVar230._8_4_ = fVar217 * fVar222;
                fVar256 = auVar203._12_4_;
                auVar230._12_4_ = fVar256 * fVar222;
                auVar179 = vsubps_avx(auVar158,auVar230);
                auVar138 = vrcpss_avx(auVar138,auVar138);
                auVar97 = vfnmadd213ss_fma(auVar138,auVar139,ZEXT416(0x40000000));
                fVar222 = auVar138._0_4_ * auVar97._0_4_;
                auVar138 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                      ZEXT416((uint)(fVar219 * (float)local_ae0._0_4_)));
                auVar282 = ZEXT1664(auVar138);
                auVar247._0_8_ = auVar203._0_8_ ^ 0x8000000080000000;
                auVar247._8_4_ = -fVar217;
                auVar247._12_4_ = -fVar256;
                auVar183._0_4_ = fVar201 * auVar179._0_4_ * fVar222;
                auVar183._4_4_ = fVar201 * auVar179._4_4_ * fVar222;
                auVar183._8_4_ = fVar201 * auVar179._8_4_ * fVar222;
                auVar183._12_4_ = fVar201 * auVar179._12_4_ * fVar222;
                auVar240._0_4_ = auVar203._0_4_ * fVar201;
                auVar240._4_4_ = auVar203._4_4_ * fVar201;
                auVar240._8_4_ = fVar217 * fVar201;
                auVar240._12_4_ = fVar256 * fVar201;
                local_b60._0_16_ = auVar203;
                local_b80._0_4_ = auVar138._0_4_;
                if (fVar218 < -fVar218) {
                  local_aa0._0_4_ = auVar105._0_4_;
                  local_b00._0_16_ = auVar240;
                  local_9c0._0_16_ = auVar183;
                  fVar201 = sqrtf(fVar218);
                  auVar282 = ZEXT464((uint)local_b80._0_4_);
                  auVar105 = ZEXT416((uint)local_aa0._0_4_);
                  auVar183 = local_9c0._0_16_;
                  auVar240 = local_b00._0_16_;
                }
                else {
                  auVar138 = vsqrtss_avx(auVar139,auVar139);
                  fVar201 = auVar138._0_4_;
                }
                auVar138 = vdpps_avx(auVar99,auVar240,0x7f);
                auVar203 = vfmadd213ss_fma(ZEXT416((uint)local_a00._0_4_),auVar105,auVar282._0_16_);
                auVar139 = vdpps_avx(auVar247,auVar240,0x7f);
                auVar179 = vdpps_avx(auVar99,auVar183,0x7f);
                local_aa0._0_16_ = vdpps_avx(local_a70,auVar240,0x7f);
                auVar203 = vfmadd213ss_fma(ZEXT416((uint)(auVar105._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_a00._0_4_ / fVar201)),
                                           auVar203);
                auVar277 = ZEXT1664(auVar203);
                fVar201 = auVar139._0_4_ + auVar179._0_4_;
                auVar103._0_4_ = auVar138._0_4_ * auVar138._0_4_;
                auVar103._4_4_ = auVar138._4_4_ * auVar138._4_4_;
                auVar103._8_4_ = auVar138._8_4_ * auVar138._8_4_;
                auVar103._12_4_ = auVar138._12_4_ * auVar138._12_4_;
                auVar105 = vdpps_avx(auVar99,auVar247,0x7f);
                auVar179 = vsubps_avx(auVar11,auVar103);
                auVar139 = vrsqrtss_avx(auVar179,auVar179);
                fVar222 = auVar179._0_4_;
                fVar219 = auVar139._0_4_;
                fVar219 = fVar219 * 1.5 + fVar222 * -0.5 * fVar219 * fVar219 * fVar219;
                auVar139 = vdpps_avx(auVar99,local_a70,0x7f);
                auVar105 = vfnmadd231ss_fma(auVar105,auVar138,ZEXT416((uint)fVar201));
                auVar139 = vfnmadd231ss_fma(auVar139,auVar138,local_aa0._0_16_);
                if (fVar222 < 0.0) {
                  local_b00._0_16_ = auVar138;
                  local_9c0._0_4_ = auVar203._0_4_;
                  local_a20._0_16_ = ZEXT416((uint)fVar201);
                  local_840._0_4_ = fVar219;
                  local_860._0_16_ = auVar139;
                  fVar222 = sqrtf(fVar222);
                  auVar277 = ZEXT464((uint)local_9c0._0_4_);
                  auVar282 = ZEXT464((uint)local_b80._0_4_);
                  fVar219 = (float)local_840._0_4_;
                  auVar139 = local_860._0_16_;
                  auVar138 = local_b00._0_16_;
                  auVar179 = local_a20._0_16_;
                }
                else {
                  auVar179 = vsqrtss_avx(auVar179,auVar179);
                  fVar222 = auVar179._0_4_;
                  auVar179 = ZEXT416((uint)fVar201);
                }
                auVar271 = ZEXT1664(local_b60._0_16_);
                auVar203 = vpermilps_avx(local_820._0_16_,0xff);
                fVar222 = fVar222 - auVar203._0_4_;
                auVar203 = vshufps_avx(local_b60._0_16_,local_b60._0_16_,0xff);
                auVar105 = vfmsub213ss_fma(auVar105,ZEXT416((uint)fVar219),auVar203);
                auVar184._0_8_ = local_aa0._0_8_ ^ 0x8000000080000000;
                auVar184._8_4_ = local_aa0._8_4_ ^ 0x80000000;
                auVar184._12_4_ = local_aa0._12_4_ ^ 0x80000000;
                auVar206._0_8_ = auVar105._0_8_ ^ 0x8000000080000000;
                auVar206._8_4_ = auVar105._8_4_ ^ 0x80000000;
                auVar206._12_4_ = auVar105._12_4_ ^ 0x80000000;
                auVar97 = ZEXT416((uint)(auVar139._0_4_ * fVar219));
                auVar139 = vfmsub231ss_fma(ZEXT416((uint)(auVar105._0_4_ * local_aa0._0_4_)),
                                           auVar179,auVar97);
                auVar105 = vinsertps_avx(auVar206,auVar97,0x1c);
                uVar95 = auVar139._0_4_;
                auVar207._4_4_ = uVar95;
                auVar207._0_4_ = uVar95;
                auVar207._8_4_ = uVar95;
                auVar207._12_4_ = uVar95;
                auVar105 = vdivps_avx(auVar105,auVar207);
                auVar139 = vinsertps_avx(auVar179,auVar184,0x10);
                auVar139 = vdivps_avx(auVar139,auVar207);
                fVar201 = auVar138._0_4_;
                auVar159._0_4_ = fVar201 * auVar105._0_4_ + fVar222 * auVar139._0_4_;
                auVar159._4_4_ = fVar201 * auVar105._4_4_ + fVar222 * auVar139._4_4_;
                auVar159._8_4_ = fVar201 * auVar105._8_4_ + fVar222 * auVar139._8_4_;
                auVar159._12_4_ = fVar201 * auVar105._12_4_ + fVar222 * auVar139._12_4_;
                auVar98 = vsubps_avx(auVar98,auVar159);
                auVar260 = ZEXT1664(auVar98);
                auVar105 = vandps_avx(auVar138,auVar238);
                fVar201 = (float)local_ac0._0_4_;
                fVar219 = (float)local_ac0._4_4_;
                fVar218 = fStack_ab8;
                fVar217 = fStack_ab4;
                fVar256 = fStack_ab0;
                fVar221 = fStack_aac;
                fVar220 = fStack_aa8;
                if (auVar105._0_4_ < auVar277._0_4_) {
                  auVar138 = vfmadd231ss_fma(ZEXT416((uint)(auVar282._0_4_ + auVar277._0_4_)),
                                             local_a40._0_16_,ZEXT416(0x36000000));
                  auVar105 = vandps_avx(ZEXT416((uint)fVar222),auVar238);
                  if (auVar105._0_4_ < auVar138._0_4_) {
                    fVar222 = auVar98._0_4_ + (float)local_960._0_4_;
                    if (fVar222 < fVar94) break;
                    fVar273 = *(float *)(ray + k * 4 + 0x100);
                    auVar277 = ZEXT464((uint)fVar273);
                    if (fVar273 < fVar222) break;
                    auVar105 = vmovshdup_avx(auVar98);
                    fVar224 = auVar105._0_4_;
                    if ((fVar224 < 0.0) || (1.0 < fVar224)) break;
                    auVar11 = vrsqrtss_avx(auVar11,auVar11);
                    fVar223 = auVar11._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar85].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    fVar216 = fVar223 * 1.5 + fVar216 * -0.5 * fVar223 * fVar223 * fVar223;
                    local_c20 = auVar99._0_4_;
                    fStack_c1c = auVar99._4_4_;
                    fStack_c18 = auVar99._8_4_;
                    fStack_c14 = auVar99._12_4_;
                    auVar185._0_4_ = fVar216 * local_c20;
                    auVar185._4_4_ = fVar216 * fStack_c1c;
                    auVar185._8_4_ = fVar216 * fStack_c18;
                    auVar185._12_4_ = fVar216 * fStack_c14;
                    auVar139 = vfmadd213ps_fma(auVar203,auVar185,local_b60._0_16_);
                    auVar11 = vshufps_avx(auVar185,auVar185,0xc9);
                    auVar99 = vshufps_avx(local_b60._0_16_,local_b60._0_16_,0xc9);
                    auVar186._0_4_ = auVar185._0_4_ * auVar99._0_4_;
                    auVar186._4_4_ = auVar185._4_4_ * auVar99._4_4_;
                    auVar186._8_4_ = auVar185._8_4_ * auVar99._8_4_;
                    auVar186._12_4_ = auVar185._12_4_ * auVar99._12_4_;
                    auVar138 = vfmsub231ps_fma(auVar186,local_b60._0_16_,auVar11);
                    auVar11 = vshufps_avx(auVar138,auVar138,0xc9);
                    auVar99 = vshufps_avx(auVar139,auVar139,0xc9);
                    auVar138 = vshufps_avx(auVar138,auVar138,0xd2);
                    auVar142._0_4_ = auVar139._0_4_ * auVar138._0_4_;
                    auVar142._4_4_ = auVar139._4_4_ * auVar138._4_4_;
                    auVar142._8_4_ = auVar139._8_4_ * auVar138._8_4_;
                    auVar142._12_4_ = auVar139._12_4_ * auVar138._12_4_;
                    auVar11 = vfmsub231ps_fma(auVar142,auVar11,auVar99);
                    uVar95 = auVar11._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar222;
                      uVar3 = vextractps_avx(auVar11,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                      uVar3 = vextractps_avx(auVar11,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                      *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar95;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar224;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_9e0;
                      *(uint *)(ray + k * 4 + 0x240) = uVar85;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar6 = context->user;
                    local_420 = auVar105._0_8_;
                    auVar99 = vmovshdup_avx(auVar11);
                    local_480._8_8_ = auVar99._0_8_;
                    auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
                    local_460 = auVar11._0_8_;
                    local_480._0_8_ = local_480._8_8_;
                    local_480._16_8_ = local_480._8_8_;
                    local_480._24_8_ = local_480._8_8_;
                    uStack_458 = local_460;
                    uStack_450 = local_460;
                    uStack_448 = local_460;
                    local_440 = uVar95;
                    uStack_43c = uVar95;
                    uStack_438 = uVar95;
                    uStack_434 = uVar95;
                    uStack_430 = uVar95;
                    uStack_42c = uVar95;
                    uStack_428 = uVar95;
                    uStack_424 = uVar95;
                    uStack_418 = local_420;
                    uStack_410 = local_420;
                    uStack_408 = local_420;
                    auVar160._12_4_ = 0;
                    auVar160._0_12_ = ZEXT812(0);
                    auVar160 = auVar160 << 0x20;
                    local_400 = ZEXT1232(ZEXT812(0)) << 0x20;
                    local_3e0 = CONCAT44(uStack_65c,local_660);
                    uStack_3d8 = CONCAT44(uStack_654,uStack_658);
                    uStack_3d0 = CONCAT44(uStack_64c,uStack_650);
                    uStack_3c8 = CONCAT44(uStack_644,uStack_648);
                    local_3c0._4_4_ = uStack_63c;
                    local_3c0._0_4_ = local_640;
                    local_3c0._8_4_ = uStack_638;
                    local_3c0._12_4_ = uStack_634;
                    local_3c0._16_4_ = uStack_630;
                    local_3c0._20_4_ = uStack_62c;
                    local_3c0._24_4_ = uStack_628;
                    local_3c0._28_4_ = uStack_624;
                    auVar110 = vpcmpeqd_avx2(local_3c0,local_3c0);
                    local_b28[1] = auVar110;
                    *local_b28 = auVar110;
                    local_3a0 = pRVar6->instID[0];
                    uStack_39c = local_3a0;
                    uStack_398 = local_3a0;
                    uStack_394 = local_3a0;
                    uStack_390 = local_3a0;
                    uStack_38c = local_3a0;
                    uStack_388 = local_3a0;
                    uStack_384 = local_3a0;
                    local_380 = pRVar6->instPrimID[0];
                    uStack_37c = local_380;
                    uStack_378 = local_380;
                    uStack_374 = local_380;
                    uStack_370 = local_380;
                    uStack_36c = local_380;
                    uStack_368 = local_380;
                    uStack_364 = local_380;
                    *(float *)(ray + k * 4 + 0x100) = fVar222;
                    local_980 = local_680;
                    local_bb0.valid = (int *)local_980;
                    local_bb0.geometryUserPtr = pGVar4->userPtr;
                    local_bb0.context = context->user;
                    local_bb0.hit = (RTCHitN *)local_480;
                    local_bb0.N = 8;
                    local_bb0.ray = (RTCRayN *)ray;
                    if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar260 = ZEXT1664(auVar98);
                      auVar271 = ZEXT1664(local_b60._0_16_);
                      auVar282 = ZEXT1664(auVar282._0_16_);
                      (*pGVar4->intersectionFilterN)(&local_bb0);
                      auVar160 = ZEXT816(0) << 0x40;
                    }
                    auVar172 = ZEXT1632(auVar160);
                    auVar110 = vpcmpeqd_avx2(local_980,auVar172);
                    auVar110 = _DAT_01fe9960 & ~auVar110;
                    fVar201 = (float)local_ac0._0_4_;
                    fVar219 = (float)local_ac0._4_4_;
                    fVar218 = fStack_ab8;
                    fVar217 = fStack_ab4;
                    fVar256 = fStack_ab0;
                    fVar221 = fStack_aac;
                    fVar220 = fStack_aa8;
                    if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar110 >> 0x7f,0) != '\0') ||
                          (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar110 >> 0xbf,0) != '\0') ||
                        (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar110[0x1f] < '\0') {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar260 = ZEXT1664(auVar260._0_16_);
                        auVar271 = ZEXT1664(auVar271._0_16_);
                        auVar282 = ZEXT1664(auVar282._0_16_);
                        (*p_Var5)(&local_bb0);
                        auVar172 = ZEXT832(0) << 0x40;
                        fVar201 = (float)local_ac0._0_4_;
                        fVar219 = (float)local_ac0._4_4_;
                        fVar218 = fStack_ab8;
                        fVar217 = fStack_ab4;
                        fVar256 = fStack_ab0;
                        fVar221 = fStack_aac;
                        fVar220 = fStack_aa8;
                      }
                      auVar277 = ZEXT464((uint)fVar273);
                      auVar172 = vpcmpeqd_avx2(local_980,auVar172);
                      auVar110 = _DAT_01fe9960 & ~auVar172;
                      if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar110 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar110 >> 0x7f,0) != '\0') ||
                            (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar110 >> 0xbf,0) != '\0') ||
                          (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar110[0x1f] < '\0') {
                        auVar123._0_8_ = auVar172._0_8_ ^ 0xffffffffffffffff;
                        auVar123._8_4_ = auVar172._8_4_ ^ 0xffffffff;
                        auVar123._12_4_ = auVar172._12_4_ ^ 0xffffffff;
                        auVar123._16_4_ = auVar172._16_4_ ^ 0xffffffff;
                        auVar123._20_4_ = auVar172._20_4_ ^ 0xffffffff;
                        auVar123._24_4_ = auVar172._24_4_ ^ 0xffffffff;
                        auVar123._28_4_ = auVar172._28_4_ ^ 0xffffffff;
                        auVar110 = vmaskmovps_avx(auVar123,*(undefined1 (*) [32])local_bb0.hit);
                        *(undefined1 (*) [32])(local_bb0.ray + 0x180) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar123,*(undefined1 (*) [32])
                                                            (local_bb0.hit + 0x20));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x1a0) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar123,*(undefined1 (*) [32])
                                                            (local_bb0.hit + 0x40));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x1c0) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar123,*(undefined1 (*) [32])
                                                            (local_bb0.hit + 0x60));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x1e0) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar123,*(undefined1 (*) [32])
                                                            (local_bb0.hit + 0x80));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x200) = auVar110;
                        auVar110 = vpmaskmovd_avx2(auVar123,*(undefined1 (*) [32])
                                                             (local_bb0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x220) = auVar110;
                        auVar110 = vpmaskmovd_avx2(auVar123,*(undefined1 (*) [32])
                                                             (local_bb0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x240) = auVar110;
                        auVar110 = vpmaskmovd_avx2(auVar123,*(undefined1 (*) [32])
                                                             (local_bb0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x260) = auVar110;
                        auVar110 = vpmaskmovd_avx2(auVar123,*(undefined1 (*) [32])
                                                             (local_bb0.hit + 0x100));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x280) = auVar110;
                        break;
                      }
                    }
                    auVar277 = ZEXT464((uint)fVar273);
                    *(float *)(ray + k * 4 + 0x100) = fVar273;
                    break;
                  }
                }
                lVar90 = lVar90 + -1;
              } while (lVar90 != 0);
              uVar95 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar121._4_4_ = uVar95;
              auVar121._0_4_ = uVar95;
              auVar121._8_4_ = uVar95;
              auVar121._12_4_ = uVar95;
              auVar121._16_4_ = uVar95;
              auVar121._20_4_ = uVar95;
              auVar121._24_4_ = uVar95;
              auVar121._28_4_ = uVar95;
              auVar172 = vcmpps_avx(_local_8c0,auVar121,2);
              auVar110 = vandps_avx(auVar172,local_6e0);
              auVar174 = ZEXT3264(auVar110);
              auVar172 = local_6e0 & auVar172;
              local_6e0 = auVar110;
            } while ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar172 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar172 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar172 >> 0x7f,0) != '\0') ||
                       (auVar172 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar172 >> 0xbf,0) != '\0') ||
                     (auVar172 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar172[0x1f] < '\0');
            auVar174 = ZEXT3264(local_360);
            auVar244 = ZEXT3264(local_7a0);
            auVar110 = local_b20;
          }
          auVar154._0_4_ = fVar201 * (float)local_800._0_4_;
          auVar154._4_4_ = fVar219 * (float)local_800._4_4_;
          auVar154._8_4_ = fVar218 * fStack_7f8;
          auVar154._12_4_ = fVar217 * fStack_7f4;
          auVar154._16_4_ = fVar256 * fStack_7f0;
          auVar154._20_4_ = fVar221 * fStack_7ec;
          auVar154._28_36_ = auVar174._28_36_;
          auVar154._24_4_ = fVar220 * fStack_7e8;
          auVar11 = vfmadd213ps_fma(local_940,_local_880,auVar154._0_32_);
          auVar11 = vfmadd213ps_fma(local_920,_local_8a0,ZEXT1632(auVar11));
          auVar64._4_4_ = uStack_8fc;
          auVar64._0_4_ = local_900;
          auVar64._8_4_ = uStack_8f8;
          auVar64._12_4_ = uStack_8f4;
          auVar64._16_4_ = uStack_8f0;
          auVar64._20_4_ = uStack_8ec;
          auVar64._24_4_ = uStack_8e8;
          auVar64._28_4_ = uStack_8e4;
          auVar172 = vandps_avx(ZEXT1632(auVar11),auVar64);
          auVar169._8_4_ = 0x3e99999a;
          auVar169._0_8_ = 0x3e99999a3e99999a;
          auVar169._12_4_ = 0x3e99999a;
          auVar169._16_4_ = 0x3e99999a;
          auVar169._20_4_ = 0x3e99999a;
          auVar169._24_4_ = 0x3e99999a;
          auVar169._28_4_ = 0x3e99999a;
          auVar172 = vcmpps_avx(auVar172,auVar169,1);
          auVar172 = vorps_avx(auVar172,local_760);
          auVar170._0_4_ = auVar110._0_4_ + (float)local_9a0._0_4_;
          auVar170._4_4_ = auVar110._4_4_ + (float)local_9a0._4_4_;
          auVar170._8_4_ = auVar110._8_4_ + fStack_998;
          auVar170._12_4_ = auVar110._12_4_ + fStack_994;
          auVar170._16_4_ = auVar110._16_4_ + fStack_990;
          auVar170._20_4_ = auVar110._20_4_ + fStack_98c;
          auVar170._24_4_ = auVar110._24_4_ + fStack_988;
          auVar170._28_4_ = auVar110._28_4_ + fStack_984;
          auVar110 = vcmpps_avx(auVar170,auVar121,2);
          local_920 = vandps_avx(auVar110,auVar244._0_32_);
          auVar171._8_4_ = 3;
          auVar171._0_8_ = 0x300000003;
          auVar171._12_4_ = 3;
          auVar171._16_4_ = 3;
          auVar171._20_4_ = 3;
          auVar171._24_4_ = 3;
          auVar171._28_4_ = 3;
          auVar199._8_4_ = 2;
          auVar199._0_8_ = 0x200000002;
          auVar199._12_4_ = 2;
          auVar199._16_4_ = 2;
          auVar199._20_4_ = 2;
          auVar199._24_4_ = 2;
          auVar199._28_4_ = 2;
          auVar110 = vblendvps_avx(auVar199,auVar171,auVar172);
          local_940 = vpcmpgtd_avx2(auVar110,local_780);
          auVar110 = vpandn_avx2(local_940,local_920);
          auVar172 = local_920 & ~local_940;
          local_700 = auVar110;
          if ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar172 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar172 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar172 >> 0x7f,0) != '\0') ||
                (auVar172 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar172 >> 0xbf,0) != '\0') ||
              (auVar172 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar172[0x1f] < '\0') {
            auVar99 = vminps_avx(auVar12,auVar100);
            auVar11 = vmaxps_avx(auVar12,auVar100);
            auVar105 = vminps_avx(auVar9,auVar10);
            auVar138 = vminps_avx(auVar99,auVar105);
            auVar99 = vmaxps_avx(auVar9,auVar10);
            auVar105 = vmaxps_avx(auVar11,auVar99);
            auVar11 = vandps_avx(auVar138,auVar238);
            auVar99 = vandps_avx(auVar105,auVar238);
            auVar11 = vmaxps_avx(auVar11,auVar99);
            auVar99 = vmovshdup_avx(auVar11);
            auVar99 = vmaxss_avx(auVar99,auVar11);
            auVar11 = vshufpd_avx(auVar11,auVar11,1);
            auVar11 = vmaxss_avx(auVar11,auVar99);
            local_a00._0_4_ = auVar11._0_4_ * 1.9073486e-06;
            local_860._0_16_ = vshufps_avx(auVar105,auVar105,0xff);
            local_8c0._4_4_ = (float)local_9a0._4_4_ + local_360._4_4_;
            local_8c0._0_4_ = (float)local_9a0._0_4_ + local_360._0_4_;
            fStack_8b8 = fStack_998 + local_360._8_4_;
            fStack_8b4 = fStack_994 + local_360._12_4_;
            fStack_8b0 = fStack_990 + local_360._16_4_;
            fStack_8ac = fStack_98c + local_360._20_4_;
            fStack_8a8 = fStack_988 + local_360._24_4_;
            fStack_8a4 = fStack_984 + local_360._28_4_;
            local_a40 = local_360;
            do {
              auVar124._8_4_ = 0x7f800000;
              auVar124._0_8_ = 0x7f8000007f800000;
              auVar124._12_4_ = 0x7f800000;
              auVar124._16_4_ = 0x7f800000;
              auVar124._20_4_ = 0x7f800000;
              auVar124._24_4_ = 0x7f800000;
              auVar124._28_4_ = 0x7f800000;
              auVar172 = vblendvps_avx(auVar124,local_a40,auVar110);
              auVar111 = vshufps_avx(auVar172,auVar172,0xb1);
              auVar111 = vminps_avx(auVar172,auVar111);
              auVar13 = vshufpd_avx(auVar111,auVar111,5);
              auVar111 = vminps_avx(auVar111,auVar13);
              auVar13 = vpermpd_avx2(auVar111,0x4e);
              auVar111 = vminps_avx(auVar111,auVar13);
              auVar111 = vcmpps_avx(auVar172,auVar111,0);
              auVar13 = auVar110 & auVar111;
              auVar172 = auVar110;
              if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar13 >> 0x7f,0) != '\0') ||
                    (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar13 >> 0xbf,0) != '\0') ||
                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar13[0x1f] < '\0') {
                auVar172 = vandps_avx(auVar111,auVar110);
              }
              uVar88 = vmovmskps_avx(auVar172);
              iVar21 = 0;
              for (; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000) {
                iVar21 = iVar21 + 1;
              }
              uVar89 = iVar21 << 2;
              local_700 = auVar110;
              *(undefined4 *)(local_700 + uVar89) = 0;
              uVar88 = *(uint *)(local_1c0 + uVar89);
              uVar89 = *(uint *)(local_340 + uVar89);
              fVar201 = auVar8._0_4_;
              if ((float)local_a80._0_4_ < 0.0) {
                fVar201 = sqrtf((float)local_a80._0_4_);
              }
              local_aa0._0_4_ = fVar201 * 1.9073486e-06;
              auVar11 = vinsertps_avx(ZEXT416(uVar89),ZEXT416(uVar88),0x10);
              auVar260 = ZEXT1664(auVar11);
              lVar90 = 5;
              do {
                auVar98 = auVar260._0_16_;
                local_b60._0_16_ = vmovshdup_avx(auVar98);
                fVar217 = local_b60._0_4_;
                fVar218 = 1.0 - fVar217;
                fVar222 = fVar218 * fVar218 * fVar218;
                fVar219 = fVar217 * fVar217 * fVar217;
                auVar99 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar222),
                                          ZEXT416((uint)fVar219));
                fVar201 = fVar217 * fVar218;
                auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar217 * fVar201 * 6.0)),
                                           ZEXT416((uint)(fVar218 * fVar201)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar138 = vfmadd231ss_fma(ZEXT416((uint)(fVar218 * fVar201 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar217 * fVar201)));
                auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar219),
                                          ZEXT416((uint)fVar222));
                fVar216 = (auVar11._0_4_ + auVar138._0_4_) * 0.16666667;
                fVar219 = fVar219 * 0.16666667;
                auVar143._0_4_ = fVar219 * fVar130;
                auVar143._4_4_ = fVar219 * fStack_bec;
                auVar143._8_4_ = fVar219 * fStack_be8;
                auVar143._12_4_ = fVar219 * fStack_be4;
                auVar187._4_4_ = fVar216;
                auVar187._0_4_ = fVar216;
                auVar187._8_4_ = fVar216;
                auVar187._12_4_ = fVar216;
                auVar11 = vfmadd132ps_fma(auVar187,auVar143,auVar9);
                fVar216 = (auVar99._0_4_ + auVar105._0_4_) * 0.16666667;
                auVar144._4_4_ = fVar216;
                auVar144._0_4_ = fVar216;
                auVar144._8_4_ = fVar216;
                auVar144._12_4_ = fVar216;
                auVar11 = vfmadd132ps_fma(auVar144,auVar11,auVar100);
                fVar219 = auVar260._0_4_;
                auVar161._4_4_ = fVar219;
                auVar161._0_4_ = fVar219;
                auVar161._8_4_ = fVar219;
                auVar161._12_4_ = fVar219;
                auVar99 = vfmadd213ps_fma(auVar161,local_a70,_DAT_01f7aa10);
                fVar222 = fVar222 * 0.16666667;
                auVar104._4_4_ = fVar222;
                auVar104._0_4_ = fVar222;
                auVar104._8_4_ = fVar222;
                auVar104._12_4_ = fVar222;
                auVar11 = vfmadd132ps_fma(auVar104,auVar11,auVar12);
                local_820._0_16_ = auVar11;
                auVar99 = vsubps_avx(auVar99,auVar11);
                auVar11 = vdpps_avx(auVar99,auVar99,0x7f);
                fVar216 = auVar11._0_4_;
                if (fVar216 < 0.0) {
                  local_b80._0_16_ = ZEXT416((uint)fVar218);
                  local_ae0._0_4_ = fVar201;
                  auVar260._0_4_ = sqrtf(fVar216);
                  auVar260._4_60_ = extraout_var_00;
                  auVar105 = auVar260._0_16_;
                  fVar201 = (float)local_ae0._0_4_;
                  auVar138 = local_b80._0_16_;
                }
                else {
                  auVar105 = vsqrtss_avx(auVar11,auVar11);
                  auVar138 = ZEXT416((uint)fVar218);
                }
                fVar222 = auVar138._0_4_;
                auVar106._4_4_ = fVar222;
                auVar106._0_4_ = fVar222;
                auVar106._8_4_ = fVar222;
                auVar106._12_4_ = fVar222;
                auVar179 = vfnmsub213ss_fma(local_b60._0_16_,local_b60._0_16_,
                                            ZEXT416((uint)(fVar201 * 4.0)));
                auVar139 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * 4.0)),auVar138,auVar138);
                fVar201 = fVar222 * -fVar222 * 0.5;
                fVar222 = auVar179._0_4_ * 0.5;
                fVar218 = auVar139._0_4_ * 0.5;
                fVar217 = fVar217 * fVar217 * 0.5;
                auVar231._0_4_ = fVar130 * fVar217;
                auVar231._4_4_ = fStack_bec * fVar217;
                auVar231._8_4_ = fStack_be8 * fVar217;
                auVar231._12_4_ = fStack_be4 * fVar217;
                auVar188._4_4_ = fVar218;
                auVar188._0_4_ = fVar218;
                auVar188._8_4_ = fVar218;
                auVar188._12_4_ = fVar218;
                auVar139 = vfmadd213ps_fma(auVar188,auVar9,auVar231);
                auVar208._4_4_ = fVar222;
                auVar208._0_4_ = fVar222;
                auVar208._8_4_ = fVar222;
                auVar208._12_4_ = fVar222;
                auVar139 = vfmadd213ps_fma(auVar208,auVar100,auVar139);
                auVar270._4_4_ = fVar201;
                auVar270._0_4_ = fVar201;
                auVar270._8_4_ = fVar201;
                auVar270._12_4_ = fVar201;
                auVar203 = vfmadd213ps_fma(auVar270,auVar12,auVar139);
                auVar139 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar138,local_b60._0_16_)
                ;
                auVar179 = vfmadd213ss_fma(local_b60._0_16_,SUB6416(ZEXT464(0xc0000000),0),auVar138)
                ;
                auVar138 = vshufps_avx(auVar98,auVar98,0x55);
                auVar189._0_4_ = fVar130 * auVar138._0_4_;
                auVar189._4_4_ = fStack_bec * auVar138._4_4_;
                auVar189._8_4_ = fStack_be8 * auVar138._8_4_;
                auVar189._12_4_ = fStack_be4 * auVar138._12_4_;
                uVar95 = auVar179._0_4_;
                auVar209._4_4_ = uVar95;
                auVar209._0_4_ = uVar95;
                auVar209._8_4_ = uVar95;
                auVar209._12_4_ = uVar95;
                auVar138 = vfmadd213ps_fma(auVar209,auVar9,auVar189);
                auVar162._0_4_ = auVar139._0_4_;
                auVar162._4_4_ = auVar162._0_4_;
                auVar162._8_4_ = auVar162._0_4_;
                auVar162._12_4_ = auVar162._0_4_;
                auVar138 = vfmadd213ps_fma(auVar162,auVar100,auVar138);
                auVar97 = vfmadd231ps_fma(auVar138,auVar12,auVar106);
                auVar139 = vdpps_avx(auVar203,auVar203,0x7f);
                auVar138 = vblendps_avx(auVar139,_DAT_01f7aa10,0xe);
                auVar179 = vrsqrtss_avx(auVar138,auVar138);
                fVar201 = auVar179._0_4_;
                fVar218 = auVar139._0_4_;
                fVar201 = fVar201 * 1.5 + fVar218 * -0.5 * fVar201 * fVar201 * fVar201;
                auVar179 = vdpps_avx(auVar203,auVar97,0x7f);
                auVar163._0_4_ = auVar97._0_4_ * fVar218;
                auVar163._4_4_ = auVar97._4_4_ * fVar218;
                auVar163._8_4_ = auVar97._8_4_ * fVar218;
                auVar163._12_4_ = auVar97._12_4_ * fVar218;
                fVar222 = auVar179._0_4_;
                auVar232._0_4_ = auVar203._0_4_ * fVar222;
                auVar232._4_4_ = auVar203._4_4_ * fVar222;
                fVar217 = auVar203._8_4_;
                auVar232._8_4_ = fVar217 * fVar222;
                fVar256 = auVar203._12_4_;
                auVar232._12_4_ = fVar256 * fVar222;
                auVar179 = vsubps_avx(auVar163,auVar232);
                auVar138 = vrcpss_avx(auVar138,auVar138);
                auVar97 = vfnmadd213ss_fma(auVar138,auVar139,ZEXT416(0x40000000));
                fVar222 = auVar138._0_4_ * auVar97._0_4_;
                auVar138 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                      ZEXT416((uint)(fVar219 * (float)local_aa0._0_4_)));
                auVar174 = ZEXT1664(auVar138);
                auVar241._0_8_ = auVar203._0_8_ ^ 0x8000000080000000;
                auVar241._8_4_ = -fVar217;
                auVar241._12_4_ = -fVar256;
                auVar190._0_4_ = fVar201 * auVar179._0_4_ * fVar222;
                auVar190._4_4_ = fVar201 * auVar179._4_4_ * fVar222;
                auVar190._8_4_ = fVar201 * auVar179._8_4_ * fVar222;
                auVar190._12_4_ = fVar201 * auVar179._12_4_ * fVar222;
                auVar259._0_4_ = auVar203._0_4_ * fVar201;
                auVar259._4_4_ = auVar203._4_4_ * fVar201;
                auVar259._8_4_ = fVar217 * fVar201;
                auVar259._12_4_ = fVar256 * fVar201;
                local_b60._0_16_ = auVar203;
                local_b80._0_4_ = auVar138._0_4_;
                if (fVar218 < -fVar218) {
                  local_ae0._0_16_ = auVar241;
                  local_b20._0_16_ = auVar259;
                  local_b00._0_16_ = auVar190;
                  fVar201 = sqrtf(fVar218);
                  auVar174 = ZEXT464((uint)local_b80._0_4_);
                  auVar105 = ZEXT416(auVar105._0_4_);
                  auVar190 = local_b00._0_16_;
                  auVar241 = local_ae0._0_16_;
                  auVar259 = local_b20._0_16_;
                }
                else {
                  auVar138 = vsqrtss_avx(auVar139,auVar139);
                  fVar201 = auVar138._0_4_;
                }
                auVar138 = vdpps_avx(auVar99,auVar259,0x7f);
                auVar97 = vfmadd213ss_fma(ZEXT416((uint)local_a00._0_4_),auVar105,auVar174._0_16_);
                auVar139 = vdpps_avx(auVar241,auVar259,0x7f);
                auVar179 = vdpps_avx(auVar99,auVar190,0x7f);
                auVar203 = vdpps_avx(local_a70,auVar259,0x7f);
                auVar97 = vfmadd213ss_fma(ZEXT416((uint)(auVar105._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_a00._0_4_ / fVar201)),auVar97)
                ;
                auVar277 = ZEXT1664(auVar97);
                fVar201 = auVar139._0_4_ + auVar179._0_4_;
                auVar282 = ZEXT464((uint)fVar201);
                fVar222 = auVar138._0_4_;
                auVar107._0_4_ = fVar222 * fVar222;
                auVar107._4_4_ = auVar138._4_4_ * auVar138._4_4_;
                auVar107._8_4_ = auVar138._8_4_ * auVar138._8_4_;
                auVar107._12_4_ = auVar138._12_4_ * auVar138._12_4_;
                auVar105 = vdpps_avx(auVar99,auVar241,0x7f);
                auVar179 = vsubps_avx(auVar11,auVar107);
                auVar139 = vrsqrtss_avx(auVar179,auVar179);
                fVar218 = auVar179._0_4_;
                fVar219 = auVar139._0_4_;
                fVar219 = fVar219 * 1.5 + fVar218 * -0.5 * fVar219 * fVar219 * fVar219;
                auVar139 = vdpps_avx(auVar99,local_a70,0x7f);
                auVar105 = vfnmadd231ss_fma(auVar105,auVar138,ZEXT416((uint)fVar201));
                auVar139 = vfnmadd231ss_fma(auVar139,auVar138,auVar203);
                if (fVar218 < 0.0) {
                  local_ae0._0_4_ = auVar97._0_4_;
                  local_b20._0_16_ = ZEXT416((uint)fVar201);
                  local_b00._0_16_ = auVar203;
                  local_9c0._0_16_ = auVar105;
                  local_a20._0_4_ = fVar219;
                  local_840._0_16_ = auVar139;
                  fVar201 = sqrtf(fVar218);
                  auVar282 = ZEXT1664(local_b20._0_16_);
                  auVar277 = ZEXT464((uint)local_ae0._0_4_);
                  auVar174 = ZEXT464((uint)local_b80._0_4_);
                  fVar219 = (float)local_a20._0_4_;
                  auVar139 = local_840._0_16_;
                  auVar203 = local_b00._0_16_;
                  auVar105 = local_9c0._0_16_;
                }
                else {
                  auVar179 = vsqrtss_avx(auVar179,auVar179);
                  fVar201 = auVar179._0_4_;
                }
                auVar271 = ZEXT1664(auVar138);
                auVar244 = ZEXT1664(local_b60._0_16_);
                auVar179 = vpermilps_avx(local_820._0_16_,0xff);
                fVar201 = fVar201 - auVar179._0_4_;
                auVar179 = vshufps_avx(local_b60._0_16_,local_b60._0_16_,0xff);
                auVar105 = vfmsub213ss_fma(auVar105,ZEXT416((uint)fVar219),auVar179);
                auVar191._0_8_ = auVar203._0_8_ ^ 0x8000000080000000;
                auVar191._8_4_ = auVar203._8_4_ ^ 0x80000000;
                auVar191._12_4_ = auVar203._12_4_ ^ 0x80000000;
                auVar210._0_8_ = auVar105._0_8_ ^ 0x8000000080000000;
                auVar210._8_4_ = auVar105._8_4_ ^ 0x80000000;
                auVar210._12_4_ = auVar105._12_4_ ^ 0x80000000;
                auVar97 = ZEXT416((uint)(auVar139._0_4_ * fVar219));
                auVar137 = auVar282._0_16_;
                auVar139 = vfmsub231ss_fma(ZEXT416((uint)(auVar203._0_4_ * auVar105._0_4_)),auVar137
                                           ,auVar97);
                auVar105 = vinsertps_avx(auVar210,auVar97,0x1c);
                uVar95 = auVar139._0_4_;
                auVar211._4_4_ = uVar95;
                auVar211._0_4_ = uVar95;
                auVar211._8_4_ = uVar95;
                auVar211._12_4_ = uVar95;
                auVar105 = vdivps_avx(auVar105,auVar211);
                auVar139 = vinsertps_avx(auVar137,auVar191,0x10);
                auVar139 = vdivps_avx(auVar139,auVar211);
                auVar164._0_4_ = fVar222 * auVar105._0_4_ + fVar201 * auVar139._0_4_;
                auVar164._4_4_ = fVar222 * auVar105._4_4_ + fVar201 * auVar139._4_4_;
                auVar164._8_4_ = fVar222 * auVar105._8_4_ + fVar201 * auVar139._8_4_;
                auVar164._12_4_ = fVar222 * auVar105._12_4_ + fVar201 * auVar139._12_4_;
                auVar98 = vsubps_avx(auVar98,auVar164);
                auVar260 = ZEXT1664(auVar98);
                auVar105 = vandps_avx(auVar138,auVar238);
                if (auVar105._0_4_ < auVar277._0_4_) {
                  auVar139 = vfmadd231ss_fma(ZEXT416((uint)(auVar174._0_4_ + auVar277._0_4_)),
                                             local_860._0_16_,ZEXT416(0x36000000));
                  auVar105 = vandps_avx(ZEXT416((uint)fVar201),auVar238);
                  if (auVar105._0_4_ < auVar139._0_4_) {
                    fVar201 = auVar98._0_4_ + (float)local_960._0_4_;
                    if ((fVar201 < fVar94) ||
                       (fVar219 = *(float *)(ray + k * 4 + 0x100), fVar219 < fVar201)) break;
                    auVar105 = vmovshdup_avx(auVar98);
                    fVar222 = auVar105._0_4_;
                    if ((fVar222 < 0.0) || (1.0 < fVar222)) break;
                    auVar11 = vrsqrtss_avx(auVar11,auVar11);
                    fVar218 = auVar11._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar85].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    fVar216 = fVar218 * 1.5 + fVar216 * -0.5 * fVar218 * fVar218 * fVar218;
                    local_c20 = auVar99._0_4_;
                    fStack_c1c = auVar99._4_4_;
                    fStack_c18 = auVar99._8_4_;
                    fStack_c14 = auVar99._12_4_;
                    auVar192._0_4_ = fVar216 * local_c20;
                    auVar192._4_4_ = fVar216 * fStack_c1c;
                    auVar192._8_4_ = fVar216 * fStack_c18;
                    auVar192._12_4_ = fVar216 * fStack_c14;
                    auVar179 = vfmadd213ps_fma(auVar179,auVar192,local_b60._0_16_);
                    auVar11 = vshufps_avx(auVar192,auVar192,0xc9);
                    auVar99 = vshufps_avx(local_b60._0_16_,local_b60._0_16_,0xc9);
                    auVar193._0_4_ = auVar192._0_4_ * auVar99._0_4_;
                    auVar193._4_4_ = auVar192._4_4_ * auVar99._4_4_;
                    auVar193._8_4_ = auVar192._8_4_ * auVar99._8_4_;
                    auVar193._12_4_ = auVar192._12_4_ * auVar99._12_4_;
                    auVar139 = vfmsub231ps_fma(auVar193,local_b60._0_16_,auVar11);
                    auVar11 = vshufps_avx(auVar139,auVar139,0xc9);
                    auVar99 = vshufps_avx(auVar179,auVar179,0xc9);
                    auVar139 = vshufps_avx(auVar139,auVar139,0xd2);
                    auVar145._0_4_ = auVar179._0_4_ * auVar139._0_4_;
                    auVar145._4_4_ = auVar179._4_4_ * auVar139._4_4_;
                    auVar145._8_4_ = auVar179._8_4_ * auVar139._8_4_;
                    auVar145._12_4_ = auVar179._12_4_ * auVar139._12_4_;
                    auVar11 = vfmsub231ps_fma(auVar145,auVar11,auVar99);
                    uVar95 = auVar11._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar201;
                      uVar3 = vextractps_avx(auVar11,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                      uVar3 = vextractps_avx(auVar11,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                      *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar95;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar222;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_9e0;
                      *(uint *)(ray + k * 4 + 0x240) = uVar85;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar6 = context->user;
                    local_420 = auVar105._0_8_;
                    auVar99 = vmovshdup_avx(auVar11);
                    local_480._8_8_ = auVar99._0_8_;
                    auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
                    local_460 = auVar11._0_8_;
                    local_480._0_8_ = local_480._8_8_;
                    local_480._16_8_ = local_480._8_8_;
                    local_480._24_8_ = local_480._8_8_;
                    uStack_458 = local_460;
                    uStack_450 = local_460;
                    uStack_448 = local_460;
                    local_440 = uVar95;
                    uStack_43c = uVar95;
                    uStack_438 = uVar95;
                    uStack_434 = uVar95;
                    uStack_430 = uVar95;
                    uStack_42c = uVar95;
                    uStack_428 = uVar95;
                    uStack_424 = uVar95;
                    uStack_418 = local_420;
                    uStack_410 = local_420;
                    uStack_408 = local_420;
                    auVar165._12_4_ = 0;
                    auVar165._0_12_ = ZEXT812(0);
                    auVar165 = auVar165 << 0x20;
                    local_400 = ZEXT1232(ZEXT812(0)) << 0x20;
                    local_3e0 = CONCAT44(uStack_65c,local_660);
                    uStack_3d8 = CONCAT44(uStack_654,uStack_658);
                    uStack_3d0 = CONCAT44(uStack_64c,uStack_650);
                    uStack_3c8 = CONCAT44(uStack_644,uStack_648);
                    local_3c0._4_4_ = uStack_63c;
                    local_3c0._0_4_ = local_640;
                    local_3c0._8_4_ = uStack_638;
                    local_3c0._12_4_ = uStack_634;
                    local_3c0._16_4_ = uStack_630;
                    local_3c0._20_4_ = uStack_62c;
                    local_3c0._24_4_ = uStack_628;
                    local_3c0._28_4_ = uStack_624;
                    auVar110 = vpcmpeqd_avx2(local_3c0,local_3c0);
                    local_b28[1] = auVar110;
                    *local_b28 = auVar110;
                    local_3a0 = pRVar6->instID[0];
                    uStack_39c = local_3a0;
                    uStack_398 = local_3a0;
                    uStack_394 = local_3a0;
                    uStack_390 = local_3a0;
                    uStack_38c = local_3a0;
                    uStack_388 = local_3a0;
                    uStack_384 = local_3a0;
                    local_380 = pRVar6->instPrimID[0];
                    uStack_37c = local_380;
                    uStack_378 = local_380;
                    uStack_374 = local_380;
                    uStack_370 = local_380;
                    uStack_36c = local_380;
                    uStack_368 = local_380;
                    uStack_364 = local_380;
                    *(float *)(ray + k * 4 + 0x100) = fVar201;
                    local_980 = local_680;
                    local_bb0.valid = (int *)local_980;
                    local_bb0.geometryUserPtr = pGVar4->userPtr;
                    local_bb0.context = context->user;
                    local_bb0.hit = (RTCHitN *)local_480;
                    local_bb0.N = 8;
                    local_bb0.ray = (RTCRayN *)ray;
                    if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar244 = ZEXT1664(local_b60._0_16_);
                      auVar260 = ZEXT1664(auVar98);
                      auVar271 = ZEXT1664(auVar138);
                      auVar277 = ZEXT1664(auVar277._0_16_);
                      auVar282 = ZEXT1664(auVar137);
                      (*pGVar4->intersectionFilterN)(&local_bb0);
                      auVar165 = ZEXT816(0) << 0x40;
                    }
                    auVar172 = ZEXT1632(auVar165);
                    auVar110 = vpcmpeqd_avx2(local_980,auVar172);
                    auVar110 = _DAT_01fe9960 & ~auVar110;
                    if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar110 >> 0x7f,0) != '\0') ||
                          (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar110 >> 0xbf,0) != '\0') ||
                        (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar110[0x1f] < '\0') {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar244 = ZEXT1664(auVar244._0_16_);
                        auVar260 = ZEXT1664(auVar260._0_16_);
                        auVar271 = ZEXT1664(auVar271._0_16_);
                        auVar277 = ZEXT1664(auVar277._0_16_);
                        auVar282 = ZEXT1664(auVar282._0_16_);
                        (*p_Var5)(&local_bb0);
                        auVar172 = ZEXT832(0) << 0x40;
                      }
                      auVar172 = vpcmpeqd_avx2(local_980,auVar172);
                      auVar110 = _DAT_01fe9960 & ~auVar172;
                      if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar110 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar110 >> 0x7f,0) != '\0') ||
                            (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar110 >> 0xbf,0) != '\0') ||
                          (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar110[0x1f] < '\0') {
                        auVar125._0_8_ = auVar172._0_8_ ^ 0xffffffffffffffff;
                        auVar125._8_4_ = auVar172._8_4_ ^ 0xffffffff;
                        auVar125._12_4_ = auVar172._12_4_ ^ 0xffffffff;
                        auVar125._16_4_ = auVar172._16_4_ ^ 0xffffffff;
                        auVar125._20_4_ = auVar172._20_4_ ^ 0xffffffff;
                        auVar125._24_4_ = auVar172._24_4_ ^ 0xffffffff;
                        auVar125._28_4_ = auVar172._28_4_ ^ 0xffffffff;
                        auVar110 = vmaskmovps_avx(auVar125,*(undefined1 (*) [32])local_bb0.hit);
                        *(undefined1 (*) [32])(local_bb0.ray + 0x180) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar125,*(undefined1 (*) [32])
                                                            (local_bb0.hit + 0x20));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x1a0) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar125,*(undefined1 (*) [32])
                                                            (local_bb0.hit + 0x40));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x1c0) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar125,*(undefined1 (*) [32])
                                                            (local_bb0.hit + 0x60));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x1e0) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar125,*(undefined1 (*) [32])
                                                            (local_bb0.hit + 0x80));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x200) = auVar110;
                        auVar110 = vpmaskmovd_avx2(auVar125,*(undefined1 (*) [32])
                                                             (local_bb0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x220) = auVar110;
                        auVar110 = vpmaskmovd_avx2(auVar125,*(undefined1 (*) [32])
                                                             (local_bb0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x240) = auVar110;
                        auVar110 = vpmaskmovd_avx2(auVar125,*(undefined1 (*) [32])
                                                             (local_bb0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x260) = auVar110;
                        auVar110 = vpmaskmovd_avx2(auVar125,*(undefined1 (*) [32])
                                                             (local_bb0.hit + 0x100));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x280) = auVar110;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar219;
                    break;
                  }
                }
                lVar90 = lVar90 + -1;
              } while (lVar90 != 0);
              uVar95 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar121._4_4_ = uVar95;
              auVar121._0_4_ = uVar95;
              auVar121._8_4_ = uVar95;
              auVar121._12_4_ = uVar95;
              auVar121._16_4_ = uVar95;
              auVar121._20_4_ = uVar95;
              auVar121._24_4_ = uVar95;
              auVar121._28_4_ = uVar95;
              auVar172 = vcmpps_avx(_local_8c0,auVar121,2);
              auVar110 = vandps_avx(auVar172,local_700);
              local_700 = local_700 & auVar172;
            } while ((((((((local_700 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_700 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_700 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_700 >> 0x7f,0) != '\0') ||
                       (local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_700 >> 0xbf,0) != '\0') ||
                     (local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_700[0x1f] < '\0');
            local_700 = auVar110;
          }
          auVar173._0_4_ = (float)local_9a0._0_4_ + local_4c0._0_4_;
          auVar173._4_4_ = (float)local_9a0._4_4_ + local_4c0._4_4_;
          auVar173._8_4_ = fStack_998 + local_4c0._8_4_;
          auVar173._12_4_ = fStack_994 + local_4c0._12_4_;
          auVar173._16_4_ = fStack_990 + local_4c0._16_4_;
          auVar173._20_4_ = fStack_98c + local_4c0._20_4_;
          auVar173._24_4_ = fStack_988 + local_4c0._24_4_;
          auVar173._28_4_ = fStack_984 + local_4c0._28_4_;
          auVar172 = vcmpps_avx(auVar173,auVar121,2);
          auVar110 = vandps_avx(local_740,local_720);
          auVar110 = vandps_avx(auVar172,auVar110);
          auVar200._0_4_ = (float)local_9a0._0_4_ + local_360._0_4_;
          auVar200._4_4_ = (float)local_9a0._4_4_ + local_360._4_4_;
          auVar200._8_4_ = fStack_998 + local_360._8_4_;
          auVar200._12_4_ = fStack_994 + local_360._12_4_;
          auVar200._16_4_ = fStack_990 + local_360._16_4_;
          auVar200._20_4_ = fStack_98c + local_360._20_4_;
          auVar200._24_4_ = fStack_988 + local_360._24_4_;
          auVar200._28_4_ = fStack_984 + local_360._28_4_;
          auVar111 = vcmpps_avx(auVar200,auVar121,2);
          auVar172 = vandps_avx(local_940,local_920);
          auVar172 = vandps_avx(auVar111,auVar172);
          auVar172 = vorps_avx(auVar110,auVar172);
          if ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar172 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar172 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar172 >> 0x7f,0) != '\0') ||
                (auVar172 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar172 >> 0xbf,0) != '\0') ||
              (auVar172 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar172[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar93 * 0x60) = auVar172;
            auVar110 = vblendvps_avx(local_360,local_4c0,auVar110);
            *(undefined1 (*) [32])(auStack_160 + uVar93 * 0x60) = auVar110;
            uVar1 = vmovlps_avx(local_690);
            (&uStack_140)[uVar93 * 0xc] = uVar1;
            aiStack_138[uVar93 * 0x18] = local_ca4 + 1;
            iVar86 = iVar86 + 1;
          }
        }
      }
    }
    if (iVar86 == 0) break;
    uVar95 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar126._4_4_ = uVar95;
    auVar126._0_4_ = uVar95;
    auVar126._8_4_ = uVar95;
    auVar126._12_4_ = uVar95;
    auVar126._16_4_ = uVar95;
    auVar126._20_4_ = uVar95;
    auVar126._24_4_ = uVar95;
    auVar126._28_4_ = uVar95;
    uVar88 = -iVar86;
    pauVar87 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar86 - 1) * 0x60);
    fVar201 = (float)local_9a0._0_4_;
    fVar216 = (float)local_9a0._4_4_;
    fVar219 = fStack_998;
    fVar222 = fStack_994;
    fVar218 = fStack_990;
    fVar217 = fStack_98c;
    fVar256 = fStack_988;
    fVar221 = fStack_984;
    while( true ) {
      auVar110 = pauVar87[1];
      auVar151._0_4_ = fVar201 + auVar110._0_4_;
      auVar151._4_4_ = fVar216 + auVar110._4_4_;
      auVar151._8_4_ = fVar219 + auVar110._8_4_;
      auVar151._12_4_ = fVar222 + auVar110._12_4_;
      auVar151._16_4_ = fVar218 + auVar110._16_4_;
      auVar151._20_4_ = fVar217 + auVar110._20_4_;
      auVar151._24_4_ = fVar256 + auVar110._24_4_;
      auVar151._28_4_ = fVar221 + auVar110._28_4_;
      auVar172 = vcmpps_avx(auVar151,auVar126,2);
      auVar111 = vandps_avx(auVar172,*pauVar87);
      local_480 = auVar111;
      auVar13 = *pauVar87 & auVar172;
      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0x7f,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0xbf,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar13[0x1f] < '\0') break;
      pauVar87 = pauVar87 + -3;
      uVar88 = uVar88 + 1;
      fVar201 = (float)local_9a0._0_4_;
      fVar216 = (float)local_9a0._4_4_;
      fVar219 = fStack_998;
      fVar222 = fStack_994;
      fVar218 = fStack_990;
      fVar217 = fStack_98c;
      fVar256 = fStack_988;
      fVar221 = fStack_984;
      if (uVar88 == 0) goto LAB_016585d9;
    }
    auVar127._8_4_ = 0x7f800000;
    auVar127._0_8_ = 0x7f8000007f800000;
    auVar127._12_4_ = 0x7f800000;
    auVar127._16_4_ = 0x7f800000;
    auVar127._20_4_ = 0x7f800000;
    auVar127._24_4_ = 0x7f800000;
    auVar127._28_4_ = 0x7f800000;
    auVar110 = vblendvps_avx(auVar127,auVar110,auVar111);
    auVar13 = vshufps_avx(auVar110,auVar110,0xb1);
    auVar13 = vminps_avx(auVar110,auVar13);
    auVar15 = vshufpd_avx(auVar13,auVar13,5);
    auVar13 = vminps_avx(auVar13,auVar15);
    auVar15 = vpermpd_avx2(auVar13,0x4e);
    auVar13 = vminps_avx(auVar13,auVar15);
    auVar110 = vcmpps_avx(auVar110,auVar13,0);
    auVar13 = auVar111 & auVar110;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      auVar111 = vandps_avx(auVar110,auVar111);
    }
    uVar91 = *(ulong *)pauVar87[2];
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar91;
    uVar89 = vmovmskps_avx(auVar111);
    iVar86 = 0;
    for (; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x80000000) {
      iVar86 = iVar86 + 1;
    }
    *(undefined4 *)(local_480 + (uint)(iVar86 << 2)) = 0;
    uVar89 = ~uVar88;
    if ((((((((local_480 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_480 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_480 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_480 >> 0x7f,0) != '\0') ||
          (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_480 >> 0xbf,0) != '\0') ||
        (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_480[0x1f] < '\0') {
      uVar89 = -uVar88;
    }
    uVar93 = (ulong)uVar89;
    local_ca4 = *(int *)(pauVar87[2] + 8);
    *pauVar87 = local_480;
    uVar95 = (undefined4)uVar91;
    auVar152._4_4_ = uVar95;
    auVar152._0_4_ = uVar95;
    auVar152._8_4_ = uVar95;
    auVar152._12_4_ = uVar95;
    auVar152._16_4_ = uVar95;
    auVar152._20_4_ = uVar95;
    auVar152._24_4_ = uVar95;
    auVar152._28_4_ = uVar95;
    auVar11 = vmovshdup_avx(auVar108);
    auVar11 = vsubps_avx(auVar11,auVar108);
    auVar128._0_4_ = auVar11._0_4_;
    auVar128._4_4_ = auVar128._0_4_;
    auVar128._8_4_ = auVar128._0_4_;
    auVar128._12_4_ = auVar128._0_4_;
    auVar128._16_4_ = auVar128._0_4_;
    auVar128._20_4_ = auVar128._0_4_;
    auVar128._24_4_ = auVar128._0_4_;
    auVar128._28_4_ = auVar128._0_4_;
    auVar11 = vfmadd132ps_fma(auVar128,auVar152,_DAT_01faff20);
    local_4c0 = ZEXT1632(auVar11);
    local_690._8_8_ = 0;
    local_690._0_8_ = *(ulong *)(local_4c0 + (uint)(iVar86 << 2));
  } while( true );
LAB_016585d9:
  uVar95 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar109._4_4_ = uVar95;
  auVar109._0_4_ = uVar95;
  auVar109._8_4_ = uVar95;
  auVar109._12_4_ = uVar95;
  auVar7 = vcmpps_avx(local_6a0,auVar109,2);
  uVar85 = vmovmskps_avx(auVar7);
  uVar85 = (uint)uVar92 & uVar85;
  if (uVar85 == 0) {
    return;
  }
  goto LAB_01655c26;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }